

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_array_intersector.cpp
# Opt level: O2

vbool<4> __thiscall
embree::sse42::InstanceArrayIntersectorKMB<4>::occluded
          (InstanceArrayIntersectorKMB<4> *this,vbool<4> *valid_i,Precalculations *pre,RayK<4> *ray,
          RayQueryContext *context,Primitive_conflict4 *prim)

{
  RayK<4> *pRVar1;
  undefined8 uVar2;
  RTCFormat RVar3;
  InstanceArray *this_00;
  RTCRayQueryContext *pRVar4;
  RawBufferView *pRVar5;
  char *pcVar6;
  RawBufferView *pRVar7;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar8;
  Accel *pAVar9;
  uint uVar10;
  undefined8 extraout_RDX;
  RawBufferView *pRVar12;
  undefined8 extraout_RDX_00;
  int iVar13;
  long lVar14;
  RTCRayQueryContext RVar15;
  uint uVar38;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  ulong uVar16;
  ulong uVar41;
  undefined1 auVar26 [16];
  uint uVar37;
  uint uVar42;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  uint uVar39;
  uint uVar43;
  undefined1 auVar35 [16];
  uint uVar40;
  uint uVar44;
  undefined1 auVar36 [16];
  undefined1 auVar45 [12];
  vfloat4 v_14;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar79;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined4 uVar80;
  undefined4 uVar102;
  undefined4 uVar103;
  vfloat4 v_9;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined4 uVar104;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  float fVar105;
  float fVar106;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar127 [12];
  float fVar125;
  float fVar139;
  undefined1 in_XMM4 [16];
  vfloat4 v_4;
  undefined1 auVar128 [16];
  float fVar126;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  float fVar145;
  float fVar185;
  float fVar186;
  undefined1 auVar146 [16];
  float fVar187;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  float fVar188;
  float fVar189;
  float fVar194;
  float fVar196;
  undefined1 in_XMM6 [16];
  undefined1 auVar190 [16];
  float fVar195;
  float fVar197;
  float fVar198;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  float fVar199;
  float fVar212;
  float fVar213;
  undefined1 in_XMM7 [16];
  vfloat4 v_20;
  float fVar214;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar215 [12];
  undefined1 in_XMM8 [16];
  vfloat4 v_2;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar229 [12];
  float fVar227;
  float fVar228;
  float fVar238;
  undefined1 in_XMM9 [16];
  vfloat4 v_16;
  undefined1 auVar230 [16];
  float fVar239;
  float fVar240;
  float fVar241;
  float fVar242;
  float fVar243;
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar245 [12];
  float fVar244;
  float fVar252;
  undefined1 in_XMM10 [16];
  vfloat4 v_12;
  undefined1 auVar246 [16];
  float fVar254;
  float fVar255;
  undefined1 auVar247 [16];
  float fVar253;
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar256 [12];
  undefined1 auVar257 [12];
  undefined1 auVar258 [12];
  undefined1 in_XMM11 [16];
  vfloat4 v_11;
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  float fVar267;
  float fVar281;
  float fVar283;
  vfloat4 v;
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  float fVar285;
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined4 uVar282;
  undefined4 uVar284;
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  float fVar286;
  float fVar287;
  float fVar295;
  float fVar296;
  undefined1 in_XMM13 [16];
  vfloat4 v_1;
  float fVar298;
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  float fVar297;
  float fVar299;
  float fVar300;
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  int iVar301;
  float fVar303;
  int iVar310;
  int iVar314;
  undefined1 in_XMM14 [16];
  vfloat4 v_7;
  float fVar302;
  float fVar311;
  float fVar315;
  int iVar317;
  float fVar318;
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  float fVar312;
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  float fVar313;
  float fVar316;
  float fVar319;
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  float fVar320;
  float fVar327;
  float fVar329;
  undefined1 in_XMM15 [16];
  vfloat4 v_15;
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  float fVar321;
  float fVar328;
  float fVar330;
  float fVar331;
  float fVar332;
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  vbool<4> vVar333;
  vfloat4 v_5;
  vfloat4 v_8;
  RayQueryContext newcontext;
  undefined1 local_2b8 [8];
  undefined8 uStack_2b0;
  undefined1 local_2a8 [8];
  float fStack_2a0;
  float fStack_29c;
  undefined1 local_298 [8];
  float fStack_290;
  float fStack_28c;
  undefined1 local_288 [8];
  float fStack_280;
  float fStack_27c;
  undefined1 local_278 [8];
  undefined8 uStack_270;
  undefined1 local_268 [8];
  undefined8 uStack_260;
  undefined1 local_258 [8];
  undefined8 uStack_250;
  undefined1 local_248 [8];
  undefined8 uStack_240;
  undefined1 local_238 [8];
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [8];
  float fStack_220;
  float fStack_21c;
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [8];
  undefined8 uStack_200;
  undefined1 local_1f8 [8];
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  undefined1 local_1d8 [8];
  float fStack_1d0;
  float fStack_1cc;
  undefined1 local_1c8 [8];
  float fStack_1c0;
  float fStack_1bc;
  undefined1 local_1b8 [8];
  float fStack_1b0;
  float fStack_1ac;
  undefined1 local_1a8 [8];
  float fStack_1a0;
  float fStack_19c;
  undefined1 local_198 [8];
  float fStack_190;
  float fStack_18c;
  undefined1 local_188 [8];
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [8];
  float fStack_170;
  float fStack_16c;
  undefined1 local_168 [8];
  float fStack_160;
  float fStack_15c;
  undefined1 local_158 [8];
  float fStack_150;
  float fStack_14c;
  undefined1 local_148 [8];
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [8];
  float fStack_130;
  float fStack_12c;
  undefined1 local_128 [16];
  undefined1 local_118 [8];
  float fStack_110;
  float fStack_10c;
  undefined1 local_108 [8];
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [8];
  float fStack_f0;
  float fStack_ec;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [8];
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [8];
  float fStack_b0;
  float fStack_ac;
  undefined1 local_a8 [8];
  float fStack_a0;
  float fStack_9c;
  undefined1 local_98 [8];
  float fStack_90;
  float fStack_8c;
  undefined1 local_88 [8];
  float fStack_80;
  float fStack_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  RTCIntersectArguments *local_68;
  undefined1 local_58 [16];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 uVar11;
  
  v_15.field_0._0_12_ = in_XMM15._0_12_;
  aVar8 = valid_i->field_0;
  this_00 = (InstanceArray *)(context->scene->geometries).items[prim->instID_].ptr;
  pAVar9 = InstanceArray::getObject(this_00,(ulong)prim->primID_);
  uVar2 = mm_lookupmask_ps._8_8_;
  auVar229 = in_XMM9._0_12_;
  auVar215 = in_XMM8._0_12_;
  auVar245 = in_XMM10._0_12_;
  auVar256 = in_XMM11._0_12_;
  auVar127 = in_XMM4._0_12_;
  uVar11 = extraout_RDX;
  if (pAVar9 != (Accel *)0x0) {
    uVar10 = (this_00->super_Geometry).mask;
    auVar146._0_4_ = -(uint)((uVar10 & *(uint *)(ray + 0x90)) == 0);
    auVar146._4_4_ = -(uint)((uVar10 & *(uint *)(ray + 0x94)) == 0);
    auVar146._8_4_ = -(uint)((uVar10 & *(uint *)(ray + 0x98)) == 0);
    auVar146._12_4_ = -(uint)((uVar10 & *(uint *)(ray + 0x9c)) == 0);
    local_58 = ~auVar146 & (undefined1  [16])aVar8;
    uVar10 = movmskps((int)extraout_RDX,local_58);
    uVar11 = CONCAT44((int)((ulong)extraout_RDX >> 0x20),uVar10);
    if (uVar10 != 0) {
      pRVar4 = context->user;
      *(undefined8 *)this = mm_lookupmask_ps._0_8_;
      *(undefined8 *)(this + 8) = uVar2;
      if (pRVar4->instID[0] == 0xffffffff) {
        RVar15.instPrimID[0] = (*prim).primID_;
        RVar15.instID[0] = (*prim).instID_;
        *pRVar4 = RVar15;
        uVar16 = (ulong)prim->primID_;
        uVar37 = (uint)(byte)(this_00->super_Geometry).field_8.field_0x1;
        auVar146 = local_58;
        if (uVar37 == 1) {
          fVar267 = (this_00->super_Geometry).fnumTimeSegments;
          fVar281 = (this_00->super_Geometry).time_range.lower;
          auVar269._0_4_ = (this_00->super_Geometry).time_range.upper - fVar281;
          auVar130._4_4_ = fVar281;
          auVar130._0_4_ = fVar281;
          auVar130._8_4_ = fVar281;
          auVar130._12_4_ = fVar281;
          auVar218._0_4_ = *(float *)(ray + 0x70) - fVar281;
          auVar218._4_4_ = *(float *)(ray + 0x74) - fVar281;
          auVar218._8_4_ = *(float *)(ray + 0x78) - fVar281;
          auVar218._12_4_ = *(float *)(ray + 0x7c) - fVar281;
          auVar269._4_4_ = auVar269._0_4_;
          auVar269._8_4_ = auVar269._0_4_;
          auVar269._12_4_ = auVar269._0_4_;
          auVar108 = divps(auVar218,auVar269);
          auVar261._0_4_ = auVar108._0_4_ * fVar267;
          auVar261._4_4_ = auVar108._4_4_ * fVar267;
          auVar261._8_4_ = auVar108._8_4_ * fVar267;
          auVar261._12_4_ = auVar108._12_4_ * fVar267;
          auVar130 = roundps(auVar130,auVar261,1);
          auVar108._0_4_ = fVar267 + -1.0;
          auVar108._4_4_ = auVar108._0_4_;
          auVar108._8_4_ = auVar108._0_4_;
          auVar108._12_4_ = auVar108._0_4_;
          auVar108 = minps(auVar130,auVar108);
          auVar108 = maxps(auVar108,ZEXT816(0));
          auVar305._0_4_ = auVar261._0_4_ - auVar108._0_4_;
          auVar305._4_4_ = auVar261._4_4_ - auVar108._4_4_;
          auVar305._8_4_ = auVar261._8_4_ - auVar108._8_4_;
          auVar305._12_4_ = auVar261._12_4_ - auVar108._12_4_;
          iVar301 = (int)auVar108._0_4_;
          iVar310 = (int)auVar108._4_4_;
          iVar314 = (int)auVar108._8_4_;
          iVar317 = (int)auVar108._12_4_;
          local_78 = (Accel *)CONCAT44(iVar310,iVar301);
          uStack_70 = (RTCRayQueryContext *)CONCAT44(iVar317,iVar314);
          lVar14 = 0;
          if ((uVar10 & 0xff) != 0) {
            for (; ((uVar10 & 0xff) >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
            }
          }
          iVar13 = *(int *)((long)&local_78 + lVar14 * 4);
          pRVar12 = (RawBufferView *)(long)iVar13;
          auVar326._0_4_ = -(uint)(iVar13 == iVar301);
          auVar326._4_4_ = -(uint)(iVar13 == iVar310);
          auVar326._8_4_ = -(uint)(iVar13 == iVar314);
          auVar326._12_4_ = -(uint)(iVar13 == iVar317);
          iVar13 = movmskps(0x100,~auVar326 & local_58);
          auVar323 = auVar305;
          _local_2b8 = local_58;
          if (iVar13 == 0) {
            pRVar5 = (this_00->l2w_buf).items;
            pRVar7 = pRVar5 + (long)pRVar12;
            RVar3 = pRVar5[(long)pRVar12].format;
            if (RVar3 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
              pcVar6 = pRVar7->ptr_ofs;
              lVar14 = pRVar7->stride * uVar16;
              auVar269 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar14)),
                                  *(undefined4 *)(pcVar6 + lVar14 + 0x10),0x1c);
              auVar269 = insertps(auVar269,*(undefined4 *)(pcVar6 + lVar14 + 0x20),0x28);
              auVar108 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar14 + 4)),
                                  *(undefined4 *)(pcVar6 + lVar14 + 0x14),0x1c);
              auVar275 = insertps(auVar108,*(undefined4 *)(pcVar6 + lVar14 + 0x24),0x28);
              auVar108 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar14 + 8)),
                                  *(undefined4 *)(pcVar6 + lVar14 + 0x18),0x1c);
              in_XMM13 = insertps(auVar108,*(undefined4 *)(pcVar6 + lVar14 + 0x28),0x28);
              auVar108 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar14 + 0xc)),
                                  *(undefined4 *)(pcVar6 + lVar14 + 0x1c),0x1c);
              in_XMM8 = insertps(auVar108,*(undefined4 *)(pcVar6 + lVar14 + 0x2c),0x28);
            }
            else if (RVar3 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
              pcVar6 = pRVar7->ptr_ofs;
              lVar14 = pRVar7->stride * uVar16;
              auVar269._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar14 + 4);
              auVar269._0_4_ = (float)*(undefined4 *)(pcVar6 + lVar14);
              auVar269._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar14 + 4) >> 0x20);
              auVar269._12_4_ = 0;
              auVar275._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar14 + 0x10);
              auVar275._0_4_ = *(undefined4 *)(pcVar6 + lVar14 + 0xc);
              auVar275._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar14 + 0x10) >> 0x20);
              auVar275._12_4_ = 0;
              in_XMM13._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar14 + 0x1c);
              in_XMM13._0_4_ = *(undefined4 *)(pcVar6 + lVar14 + 0x18);
              in_XMM13._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar14 + 0x1c) >> 0x20);
              in_XMM13._12_4_ = 0;
              in_XMM8._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar14 + 0x28);
              in_XMM8._0_4_ = *(undefined4 *)(pcVar6 + lVar14 + 0x24);
              in_XMM8._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar14 + 0x28) >> 0x20);
              in_XMM8._12_4_ = 0;
            }
            else if (RVar3 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
              pcVar6 = pRVar7->ptr_ofs;
              lVar14 = pRVar7->stride * uVar16;
              auVar290._8_8_ = 0;
              auVar290._0_8_ = *(ulong *)(pcVar6 + lVar14 + 0x10);
              auVar130 = insertps(auVar290,*(undefined4 *)(pcVar6 + lVar14 + 8),0x20);
              auVar203._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar14 + 0x34);
              auVar203._0_4_ = *(undefined4 *)(pcVar6 + lVar14);
              auVar203._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar14 + 0x34) >> 0x20);
              auVar203._12_4_ = 0;
              auVar221._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar14 + 0x1c);
              auVar221._0_4_ = *(undefined4 *)(pcVar6 + lVar14 + 0x18);
              auVar221._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar14 + 0x1c) >> 0x20);
              auVar221._12_4_ = 0;
              fVar267 = *(float *)(pcVar6 + lVar14 + 0x24);
              fVar281 = *(float *)(pcVar6 + lVar14 + 0x28);
              fVar283 = *(float *)(pcVar6 + lVar14 + 0x2c);
              fVar285 = *(float *)(pcVar6 + lVar14 + 0x30);
              fVar106 = fVar285 * fVar285 +
                        fVar283 * fVar283 + fVar267 * fVar267 + fVar281 * fVar281;
              auVar269 = rsqrtss(ZEXT416((uint)fVar106),ZEXT416((uint)fVar106));
              fVar105 = auVar269._0_4_;
              auVar133._4_12_ = auVar269._4_12_;
              fVar105 = fVar105 * fVar105 * fVar106 * -0.5 * fVar105 + fVar105 * 1.5;
              in_XMM8 = insertps(auVar221,ZEXT416((uint)(fVar267 * fVar105)),0x30);
              auVar269 = insertps(auVar203,ZEXT416((uint)(fVar281 * fVar105)),0x30);
              auVar133._0_4_ = fVar105 * fVar285;
              auVar108 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar14 + 0xc)),
                                  *(undefined4 *)(pcVar6 + lVar14 + 4),0x10);
              in_XMM13 = insertps(auVar130,auVar133,0x30);
              auVar108 = insertps(auVar108,*(undefined4 *)(pcVar6 + lVar14 + 0x3c),0x20);
              auVar275 = insertps(auVar108,ZEXT416((uint)(fVar283 * fVar105)),0x30);
            }
            else {
              auVar275 = auVar305;
              if (RVar3 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
                pcVar6 = pRVar7->ptr_ofs;
                lVar14 = pRVar7->stride * uVar16;
                auVar269 = *(undefined1 (*) [16])(pcVar6 + lVar14);
                auVar275 = *(undefined1 (*) [16])(pcVar6 + lVar14 + 0x10);
                in_XMM13 = *(undefined1 (*) [16])(pcVar6 + lVar14 + 0x20);
                in_XMM8 = *(undefined1 (*) [16])(pcVar6 + lVar14 + 0x30);
              }
            }
            fVar267 = auVar269._0_4_;
            fVar281 = auVar269._4_4_;
            fVar283 = auVar269._8_4_;
            fVar285 = auVar269._12_4_;
            fVar189 = auVar275._0_4_;
            fVar253 = auVar275._4_4_;
            fVar187 = auVar275._8_4_;
            fVar195 = auVar275._12_4_;
            auVar263._4_4_ = fVar253;
            auVar263._0_4_ = fVar253;
            auVar263._8_4_ = fVar253;
            auVar263._12_4_ = fVar253;
            fVar197 = in_XMM13._0_4_;
            fVar120 = in_XMM13._4_4_;
            fVar124 = in_XMM13._8_4_;
            fVar121 = in_XMM13._12_4_;
            auVar232._4_4_ = fVar120;
            auVar232._0_4_ = fVar120;
            auVar232._8_4_ = fVar120;
            auVar232._12_4_ = fVar120;
            auVar249._4_4_ = fVar124;
            auVar249._0_4_ = fVar124;
            auVar249._8_4_ = fVar124;
            auVar249._12_4_ = fVar124;
            fVar106 = in_XMM8._0_4_;
            fVar119 = in_XMM8._4_4_;
            fVar79 = in_XMM8._8_4_;
            fVar105 = in_XMM8._12_4_;
            auVar205._4_4_ = fVar119;
            auVar205._0_4_ = fVar119;
            auVar205._8_4_ = fVar119;
            auVar205._12_4_ = fVar119;
            RVar3 = pRVar7[1].format;
            if (RVar3 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
              pcVar6 = pRVar7[1].ptr_ofs;
              lVar14 = uVar16 * pRVar7[1].stride;
              auVar269 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar14)),
                                  *(undefined4 *)(pcVar6 + lVar14 + 0x10),0x1c);
              auVar249 = insertps(auVar269,*(undefined4 *)(pcVar6 + lVar14 + 0x20),0x28);
              auVar269 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar14 + 4)),
                                  *(undefined4 *)(pcVar6 + lVar14 + 0x14),0x1c);
              auVar232 = insertps(auVar269,*(undefined4 *)(pcVar6 + lVar14 + 0x24),0x28);
              auVar269 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar14 + 8)),
                                  *(undefined4 *)(pcVar6 + lVar14 + 0x18),0x1c);
              auVar205 = insertps(auVar269,*(undefined4 *)(pcVar6 + lVar14 + 0x28),0x28);
              auVar269 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar14 + 0xc)),
                                  *(undefined4 *)(pcVar6 + lVar14 + 0x1c),0x1c);
              auVar263 = insertps(auVar269,*(undefined4 *)(pcVar6 + lVar14 + 0x2c),0x28);
            }
            else if (RVar3 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
              pcVar6 = pRVar7[1].ptr_ofs;
              lVar14 = uVar16 * pRVar7[1].stride;
              auVar249._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar14 + 4);
              auVar249._0_4_ = *(undefined4 *)(pcVar6 + lVar14);
              auVar249._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar14 + 4) >> 0x20);
              auVar249._12_4_ = 0;
              auVar232._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar14 + 0x10);
              auVar232._0_4_ = *(undefined4 *)(pcVar6 + lVar14 + 0xc);
              auVar232._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar14 + 0x10) >> 0x20);
              auVar232._12_4_ = 0;
              auVar205._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar14 + 0x1c);
              auVar205._0_4_ = *(undefined4 *)(pcVar6 + lVar14 + 0x18);
              auVar205._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar14 + 0x1c) >> 0x20);
              auVar205._12_4_ = 0;
              auVar263._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar14 + 0x28);
              auVar263._0_4_ = *(undefined4 *)(pcVar6 + lVar14 + 0x24);
              auVar263._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar14 + 0x28) >> 0x20);
              auVar263._12_4_ = 0;
            }
            else if (RVar3 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
              pcVar6 = pRVar7[1].ptr_ofs;
              lVar14 = uVar16 * pRVar7[1].stride;
              auVar204._8_8_ = 0;
              auVar204._0_8_ = *(ulong *)(pcVar6 + lVar14 + 0x10);
              auVar108 = insertps(auVar204,*(undefined4 *)(pcVar6 + lVar14 + 8),0x20);
              auVar248._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar14 + 0x34);
              auVar248._0_4_ = *(undefined4 *)(pcVar6 + lVar14);
              auVar248._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar14 + 0x34) >> 0x20);
              auVar248._12_4_ = 0;
              auVar262._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar14 + 0x1c);
              auVar262._0_4_ = *(undefined4 *)(pcVar6 + lVar14 + 0x18);
              auVar262._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar14 + 0x1c) >> 0x20);
              auVar262._12_4_ = 0;
              fVar122 = *(float *)(pcVar6 + lVar14 + 0x24);
              fVar123 = *(float *)(pcVar6 + lVar14 + 0x28);
              fVar125 = *(float *)(pcVar6 + lVar14 + 0x2c);
              fVar126 = *(float *)(pcVar6 + lVar14 + 0x30);
              fVar140 = fVar126 * fVar126 +
                        fVar125 * fVar125 + fVar122 * fVar122 + fVar123 * fVar123;
              auVar269 = rsqrtss(ZEXT416((uint)fVar140),ZEXT416((uint)fVar140));
              fVar139 = auVar269._0_4_;
              auVar134._4_12_ = auVar269._4_12_;
              fVar139 = fVar139 * fVar139 * fVar140 * -0.5 * fVar139 + fVar139 * 1.5;
              auVar263 = insertps(auVar262,ZEXT416((uint)(fVar122 * fVar139)),0x30);
              auVar249 = insertps(auVar248,ZEXT416((uint)(fVar123 * fVar139)),0x30);
              auVar134._0_4_ = fVar139 * fVar126;
              auVar269 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar14 + 0xc)),
                                  *(undefined4 *)(pcVar6 + lVar14 + 4),0x10);
              auVar205 = insertps(auVar108,auVar134,0x30);
              auVar269 = insertps(auVar269,*(undefined4 *)(pcVar6 + lVar14 + 0x3c),0x20);
              auVar232 = insertps(auVar269,ZEXT416((uint)(fVar125 * fVar139)),0x30);
            }
            else if (RVar3 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
              pcVar6 = pRVar7[1].ptr_ofs;
              lVar14 = uVar16 * pRVar7[1].stride;
              auVar249 = *(undefined1 (*) [16])(pcVar6 + lVar14);
              auVar232 = *(undefined1 (*) [16])(pcVar6 + lVar14 + 0x10);
              auVar205 = *(undefined1 (*) [16])(pcVar6 + lVar14 + 0x20);
              auVar263 = *(undefined1 (*) [16])(pcVar6 + lVar14 + 0x30);
            }
            auVar250._12_4_ = auVar249._12_4_;
            auVar250._4_4_ = auVar250._12_4_;
            auVar250._0_4_ = auVar250._12_4_;
            auVar250._8_4_ = auVar250._12_4_;
            auVar264._12_4_ = auVar263._12_4_;
            auVar264._4_4_ = auVar264._12_4_;
            auVar264._0_4_ = auVar264._12_4_;
            auVar264._8_4_ = auVar264._12_4_;
            auVar233._12_4_ = auVar232._12_4_;
            auVar233._4_4_ = auVar233._12_4_;
            auVar233._0_4_ = auVar233._12_4_;
            auVar233._8_4_ = auVar233._12_4_;
            auVar206._12_4_ = auVar205._12_4_;
            auVar206._4_4_ = auVar206._12_4_;
            auVar206._0_4_ = auVar206._12_4_;
            auVar206._8_4_ = auVar206._12_4_;
            auVar111._0_4_ =
                 fVar121 * auVar206._12_4_ +
                 fVar195 * auVar233._12_4_ + fVar285 * auVar250._12_4_ + fVar105 * auVar264._12_4_;
            auVar111._4_4_ =
                 fVar121 * auVar206._12_4_ +
                 fVar195 * auVar233._12_4_ + fVar285 * auVar250._12_4_ + fVar105 * auVar264._12_4_;
            auVar111._8_4_ =
                 fVar121 * auVar206._12_4_ +
                 fVar195 * auVar233._12_4_ + fVar285 * auVar250._12_4_ + fVar105 * auVar264._12_4_;
            auVar111._12_4_ =
                 fVar121 * auVar206._12_4_ +
                 fVar195 * auVar233._12_4_ + fVar285 * auVar250._12_4_ + fVar105 * auVar264._12_4_;
            uVar16 = CONCAT44(auVar111._4_4_,auVar111._0_4_);
            auVar307._0_8_ = uVar16 ^ 0x8000000080000000;
            auVar307._8_4_ = -auVar111._8_4_;
            auVar307._12_4_ = -auVar111._12_4_;
            auVar20._4_4_ = -(uint)(auVar111._4_4_ < -auVar111._4_4_);
            auVar20._0_4_ = -(uint)(auVar111._0_4_ < -auVar111._0_4_);
            auVar20._8_4_ = -(uint)(auVar111._8_4_ < auVar307._8_4_);
            auVar20._12_4_ = -(uint)(auVar111._12_4_ < auVar307._12_4_);
            uVar16 = CONCAT44(auVar264._12_4_,auVar264._12_4_);
            auVar84._0_8_ = uVar16 ^ 0x8000000080000000;
            auVar84._8_4_ = -auVar264._12_4_;
            auVar84._12_4_ = -auVar264._12_4_;
            auVar261 = blendvps(auVar264,auVar84,auVar20);
            uVar16 = CONCAT44(auVar250._12_4_,auVar250._12_4_);
            auVar85._0_8_ = uVar16 ^ 0x8000000080000000;
            auVar85._8_4_ = -auVar250._12_4_;
            auVar85._12_4_ = -auVar250._12_4_;
            auVar218 = blendvps(auVar250,auVar85,auVar20);
            uVar16 = CONCAT44(auVar233._12_4_,auVar233._12_4_);
            auVar86._0_8_ = uVar16 ^ 0x8000000080000000;
            auVar86._8_4_ = -auVar233._12_4_;
            auVar86._12_4_ = -auVar233._12_4_;
            auVar130 = blendvps(auVar233,auVar86,auVar20);
            uVar16 = CONCAT44(auVar206._12_4_,auVar206._12_4_);
            auVar87._0_8_ = uVar16 ^ 0x8000000080000000;
            auVar87._8_4_ = -auVar206._12_4_;
            auVar87._12_4_ = -auVar206._12_4_;
            auVar108 = blendvps(auVar206,auVar87,auVar20);
            auVar323 = maxps(auVar307,auVar111);
            fVar122 = ABS(auVar111._0_4_);
            fVar123 = ABS(auVar111._4_4_);
            uVar16 = CONCAT44(auVar111._4_4_,auVar111._0_4_);
            auVar112._0_8_ = uVar16 & 0x7fffffff7fffffff;
            auVar112._8_4_ = ABS(auVar111._8_4_);
            auVar112._12_4_ = ABS(auVar111._12_4_);
            auVar88._0_4_ = 1.0 - fVar122;
            auVar88._4_4_ = 1.0 - fVar123;
            auVar88._8_4_ = 1.0 - auVar112._8_4_;
            auVar88._12_4_ = 1.0 - auVar112._12_4_;
            auVar269 = sqrtps(auVar88,auVar88);
            auVar21._0_4_ =
                 1.5707964 -
                 auVar269._0_4_ *
                 (((((fVar122 * -0.0043095737 + 0.0192803) * fVar122 + -0.04489909) * fVar122 +
                   0.08785567) * fVar122 + -0.21450998) * fVar122 + 1.5707952);
            auVar21._4_4_ =
                 1.5707964 -
                 auVar269._4_4_ *
                 (((((fVar123 * -0.0043095737 + 0.0192803) * fVar123 + -0.04489909) * fVar123 +
                   0.08785567) * fVar123 + -0.21450998) * fVar123 + 1.5707952);
            auVar21._8_4_ =
                 1.5707964 -
                 auVar269._8_4_ *
                 (((((auVar112._8_4_ * -0.0043095737 + 0.0192803) * auVar112._8_4_ + -0.04489909) *
                    auVar112._8_4_ + 0.08785567) * auVar112._8_4_ + -0.21450998) * auVar112._8_4_ +
                 1.5707952);
            auVar21._12_4_ =
                 1.5707964 -
                 auVar269._12_4_ *
                 (((((auVar112._12_4_ * -0.0043095737 + 0.0192803) * auVar112._12_4_ + -0.04489909)
                    * auVar112._12_4_ + 0.08785567) * auVar112._12_4_ + -0.21450998) *
                  auVar112._12_4_ + 1.5707952);
            auVar269 = maxps(ZEXT816(0),auVar21);
            fVar311 = auVar323._0_4_;
            fVar315 = auVar323._4_4_;
            fVar318 = auVar323._8_4_;
            fVar287 = auVar323._12_4_;
            auVar22._4_4_ = -(uint)(fVar315 < 0.0);
            auVar22._0_4_ = -(uint)(fVar311 < 0.0);
            auVar22._8_4_ = -(uint)(fVar318 < 0.0);
            auVar22._12_4_ = -(uint)(fVar287 < 0.0);
            auVar148._0_8_ = auVar269._0_8_ ^ 0x8000000080000000;
            auVar148._8_4_ = auVar269._8_4_ ^ 0x80000000;
            auVar148._12_4_ = auVar269._12_4_ ^ 0x80000000;
            auVar269 = blendvps(auVar269,auVar148,auVar22);
            auVar149._0_4_ = 1.5707964 - auVar269._0_4_;
            auVar149._4_4_ = 1.5707964 - auVar269._4_4_;
            auVar149._8_4_ = 1.5707964 - auVar269._8_4_;
            auVar149._12_4_ = 1.5707964 - auVar269._12_4_;
            auVar23._4_4_ = -(uint)(1.0 < fVar123);
            auVar23._0_4_ = -(uint)(1.0 < fVar122);
            auVar23._8_4_ = -(uint)(1.0 < auVar112._8_4_);
            auVar23._12_4_ = -(uint)(1.0 < auVar112._12_4_);
            auVar269 = blendvps(auVar149,_DAT_01f4bc50,auVar23);
            fVar122 = auVar269._0_4_ * auVar305._0_4_;
            fVar123 = auVar269._4_4_ * auVar305._4_4_;
            fVar125 = auVar269._8_4_ * auVar305._8_4_;
            fVar126 = auVar269._12_4_ * auVar305._12_4_;
            auVar24._0_4_ = fVar122 * 0.63661975;
            auVar24._4_4_ = fVar123 * 0.63661975;
            auVar24._8_4_ = fVar125 * 0.63661975;
            auVar24._12_4_ = fVar126 * 0.63661975;
            auVar269 = roundps(auVar112,auVar24,1);
            auVar25._0_8_ = CONCAT44((int)auVar269._4_4_,(int)auVar269._0_4_);
            auVar25._8_4_ = (int)auVar269._8_4_;
            auVar25._12_4_ = (int)auVar269._12_4_;
            fVar122 = fVar122 - auVar269._0_4_ * 1.5707964;
            fVar123 = fVar123 - auVar269._4_4_ * 1.5707964;
            fVar125 = fVar125 - auVar269._8_4_ * 1.5707964;
            fVar126 = fVar126 - auVar269._12_4_ * 1.5707964;
            auVar234._0_8_ = auVar25._0_8_ & 0x300000003;
            auVar234._8_8_ = auVar25._8_8_ & 0x300000003;
            fVar139 = fVar122 * fVar122;
            fVar140 = fVar123 * fVar123;
            fVar141 = fVar125 * fVar125;
            fVar142 = fVar126 * fVar126;
            uVar16 = auVar25._0_8_ & (ulong)DAT_01f46b40;
            uVar41 = auVar25._8_8_ & DAT_01f46b40._8_8_;
            iVar301 = (int)uVar16;
            auVar135._0_4_ = -(uint)(iVar301 == 0);
            iVar310 = (int)(uVar16 >> 0x20);
            auVar135._4_4_ = -(uint)(iVar310 == 0);
            iVar314 = (int)uVar41;
            iVar317 = (int)(uVar41 >> 0x20);
            auVar135._8_4_ = -(uint)(iVar314 == 0);
            auVar135._12_4_ = -(uint)(iVar317 == 0);
            auVar89._4_4_ = -iVar310;
            auVar89._0_4_ = -iVar301;
            auVar89._8_4_ = -iVar314;
            auVar89._12_4_ = -iVar317;
            auVar276._0_8_ =
                 CONCAT44((((((fVar140 * -2.5029328e-08 + 2.7600126e-06) * fVar140 + -0.00019842605)
                             * fVar140 + 0.008333348) * fVar140 + -0.16666667) * fVar140 + 1.0) *
                          fVar123,(((((fVar139 * -2.5029328e-08 + 2.7600126e-06) * fVar139 +
                                     -0.00019842605) * fVar139 + 0.008333348) * fVar139 +
                                   -0.16666667) * fVar139 + 1.0) * fVar122);
            auVar276._8_4_ =
                 (((((fVar141 * -2.5029328e-08 + 2.7600126e-06) * fVar141 + -0.00019842605) *
                    fVar141 + 0.008333348) * fVar141 + -0.16666667) * fVar141 + 1.0) * fVar125;
            auVar276._12_4_ =
                 (((((fVar142 * -2.5029328e-08 + 2.7600126e-06) * fVar142 + -0.00019842605) *
                    fVar142 + 0.008333348) * fVar142 + -0.16666667) * fVar142 + 1.0) * fVar126;
            auVar207._0_4_ =
                 ((((fVar139 * -2.5963018e-07 + 2.4756235e-05) * fVar139 + -0.001388833) * fVar139 +
                  0.04166664) * fVar139 + -0.5) * fVar139 + 1.0;
            auVar207._4_4_ =
                 ((((fVar140 * -2.5963018e-07 + 2.4756235e-05) * fVar140 + -0.001388833) * fVar140 +
                  0.04166664) * fVar140 + -0.5) * fVar140 + 1.0;
            auVar207._8_4_ =
                 ((((fVar141 * -2.5963018e-07 + 2.4756235e-05) * fVar141 + -0.001388833) * fVar141 +
                  0.04166664) * fVar141 + -0.5) * fVar141 + 1.0;
            auVar207._12_4_ =
                 ((((fVar142 * -2.5963018e-07 + 2.4756235e-05) * fVar142 + -0.001388833) * fVar142 +
                  0.04166664) * fVar142 + -0.5) * fVar142 + 1.0;
            auVar150._8_4_ = auVar276._8_4_;
            auVar150._0_8_ = auVar276._0_8_;
            auVar150._12_4_ = auVar276._12_4_;
            auVar269 = blendvps(auVar150,auVar207,auVar89);
            auVar323 = blendvps(auVar276,auVar207,auVar135);
            uVar39 = (uint)DAT_01f46b40;
            auVar26._0_4_ = -(uint)((int)uVar39 < (int)auVar234._0_8_);
            iVar301 = (int)(auVar234._0_8_ >> 0x20);
            uVar40 = DAT_01f46b40._4_4_;
            auVar26._4_4_ = -(uint)((int)uVar40 < iVar301);
            uVar43 = DAT_01f46b40._8_4_;
            iVar310 = (int)(auVar234._8_8_ >> 0x20);
            auVar26._8_4_ = -(uint)((int)uVar43 < (int)auVar234._8_8_);
            uVar44 = DAT_01f46b40._12_4_;
            auVar26._12_4_ = -(uint)((int)uVar44 < iVar310);
            auVar90._0_8_ = auVar269._0_8_ ^ 0x8000000080000000;
            auVar90._8_4_ = auVar269._8_4_ ^ 0x80000000;
            auVar90._12_4_ = auVar269._12_4_ ^ 0x80000000;
            auVar269 = blendvps(auVar269,auVar90,auVar26);
            uVar10 = (int)auVar234._0_8_ - 1;
            uVar37 = iVar301 - 1;
            uVar38 = (int)auVar234._8_8_ - 1;
            uVar42 = iVar310 - 1;
            auVar113._0_4_ =
                 -(uint)(((uVar10 < uVar39) * uVar10 | (uVar10 >= uVar39) * uVar39) == uVar10);
            auVar113._4_4_ =
                 -(uint)(((uVar37 < uVar40) * uVar37 | (uVar37 >= uVar40) * uVar40) == uVar37);
            auVar113._8_4_ =
                 -(uint)(((uVar38 < uVar43) * uVar38 | (uVar38 >= uVar43) * uVar43) == uVar38);
            auVar113._12_4_ =
                 -(uint)(((uVar42 < uVar44) * uVar42 | (uVar42 >= uVar44) * uVar44) == uVar42);
            auVar191._0_8_ = auVar323._0_8_ ^ 0x8000000080000000;
            auVar191._8_4_ = auVar323._8_4_ ^ 0x80000000;
            auVar191._12_4_ = auVar323._12_4_ ^ 0x80000000;
            auVar323 = blendvps(auVar323,auVar191,auVar113);
            fVar122 = fVar105 * fVar311 - auVar261._0_4_;
            fVar123 = fVar105 * fVar315 - auVar261._4_4_;
            fVar125 = fVar105 * fVar318 - auVar261._8_4_;
            fVar126 = fVar105 * fVar287 - auVar261._12_4_;
            local_a8._0_4_ = auVar218._0_4_;
            local_a8._4_4_ = auVar218._4_4_;
            fStack_a0 = auVar218._8_4_;
            fStack_9c = auVar218._12_4_;
            fVar142 = fVar285 * fVar311 - (float)local_a8._0_4_;
            fVar143 = fVar285 * fVar315 - (float)local_a8._4_4_;
            fVar144 = fVar285 * fVar318 - fStack_a0;
            fVar145 = fVar285 * fVar287 - fStack_9c;
            fVar185 = fVar195 * fVar311 - auVar130._0_4_;
            fVar186 = fVar195 * fVar315 - auVar130._4_4_;
            fVar188 = fVar195 * fVar318 - auVar130._8_4_;
            fVar194 = fVar195 * fVar287 - auVar130._12_4_;
            local_2b8._0_4_ = auVar108._0_4_;
            local_2b8._4_4_ = auVar108._4_4_;
            uStack_2b0._0_4_ = auVar108._8_4_;
            uStack_2b0._4_4_ = auVar108._12_4_;
            fVar238 = fVar121 * fVar311 - (float)local_2b8._0_4_;
            fVar239 = fVar121 * fVar315 - (float)local_2b8._4_4_;
            fVar240 = fVar121 * fVar318 - (float)uStack_2b0;
            fVar241 = fVar121 * fVar287 - uStack_2b0._4_4_;
            auVar91._0_4_ =
                 fVar238 * fVar238 + fVar185 * fVar185 + fVar142 * fVar142 + fVar122 * fVar122;
            auVar91._4_4_ =
                 fVar239 * fVar239 + fVar186 * fVar186 + fVar143 * fVar143 + fVar123 * fVar123;
            auVar91._8_4_ =
                 fVar240 * fVar240 + fVar188 * fVar188 + fVar144 * fVar144 + fVar125 * fVar125;
            auVar91._12_4_ =
                 fVar241 * fVar241 + fVar194 * fVar194 + fVar145 * fVar145 + fVar126 * fVar126;
            auVar108 = rsqrtps(auVar234,auVar91);
            fVar139 = auVar108._0_4_;
            fVar140 = auVar108._4_4_;
            fVar141 = auVar108._8_4_;
            fVar196 = auVar108._12_4_;
            fVar320 = fVar139 * 1.5 - fVar139 * fVar139 * auVar91._0_4_ * 0.5 * fVar139;
            fVar327 = fVar140 * 1.5 - fVar140 * fVar140 * auVar91._4_4_ * 0.5 * fVar140;
            fVar329 = fVar141 * 1.5 - fVar141 * fVar141 * auVar91._8_4_ * 0.5 * fVar141;
            fVar331 = fVar196 * 1.5 - fVar196 * fVar196 * auVar91._12_4_ * 0.5 * fVar196;
            fVar196 = auVar269._0_4_;
            fVar199 = auVar269._4_4_;
            fVar213 = auVar269._8_4_;
            fVar227 = auVar269._12_4_;
            fVar295 = auVar323._0_4_;
            fVar296 = auVar323._4_4_;
            fVar298 = auVar323._8_4_;
            fVar302 = auVar323._12_4_;
            local_288._4_4_ = fVar105 * fVar296 - fVar123 * fVar327 * fVar199;
            local_288._0_4_ = fVar105 * fVar295 - fVar122 * fVar320 * fVar196;
            fStack_280 = fVar105 * fVar298 - fVar125 * fVar329 * fVar213;
            fStack_27c = fVar105 * fVar302 - fVar126 * fVar331 * fVar227;
            fVar139 = (auVar261._0_4_ - fVar105) * auVar305._0_4_ + fVar105;
            fVar140 = (auVar261._4_4_ - fVar105) * auVar305._4_4_ + fVar105;
            fVar141 = (auVar261._8_4_ - fVar105) * auVar305._8_4_ + fVar105;
            fVar105 = (auVar261._12_4_ - fVar105) * auVar305._12_4_ + fVar105;
            fVar122 = ((float)local_a8._0_4_ - fVar285) * auVar305._0_4_ + fVar285;
            fVar123 = ((float)local_a8._4_4_ - fVar285) * auVar305._4_4_ + fVar285;
            fVar125 = (fStack_a0 - fVar285) * auVar305._8_4_ + fVar285;
            fVar126 = (fStack_9c - fVar285) * auVar305._12_4_ + fVar285;
            fVar198 = (auVar130._0_4_ - fVar195) * auVar305._0_4_ + fVar195;
            fVar212 = (auVar130._4_4_ - fVar195) * auVar305._4_4_ + fVar195;
            fVar214 = (auVar130._8_4_ - fVar195) * auVar305._8_4_ + fVar195;
            fVar228 = (auVar130._12_4_ - fVar195) * auVar305._12_4_ + fVar195;
            auVar208._0_4_ = fVar198 * fVar198 + fVar122 * fVar122 + fVar139 * fVar139;
            auVar208._4_4_ = fVar212 * fVar212 + fVar123 * fVar123 + fVar140 * fVar140;
            auVar208._8_4_ = fVar214 * fVar214 + fVar125 * fVar125 + fVar141 * fVar141;
            auVar208._12_4_ = fVar228 * fVar228 + fVar126 * fVar126 + fVar105 * fVar105;
            fVar254 = ((float)local_2b8._0_4_ - fVar121) * auVar305._0_4_ + fVar121;
            fVar255 = ((float)local_2b8._4_4_ - fVar121) * auVar305._4_4_ + fVar121;
            fVar312 = ((float)uStack_2b0 - fVar121) * auVar305._8_4_ + fVar121;
            fVar286 = (uStack_2b0._4_4_ - fVar121) * auVar305._12_4_ + fVar121;
            auVar222._0_4_ = fVar254 * fVar254 + auVar208._0_4_;
            auVar222._4_4_ = fVar255 * fVar255 + auVar208._4_4_;
            auVar222._8_4_ = fVar312 * fVar312 + auVar208._8_4_;
            auVar222._12_4_ = fVar286 * fVar286 + auVar208._12_4_;
            auVar269 = rsqrtps(auVar208,auVar222);
            fVar242 = auVar269._0_4_;
            fVar243 = auVar269._4_4_;
            fVar244 = auVar269._8_4_;
            fVar252 = auVar269._12_4_;
            fVar242 = fVar242 * 1.5 - fVar242 * fVar242 * auVar222._0_4_ * 0.5 * fVar242;
            fVar243 = fVar243 * 1.5 - fVar243 * fVar243 * auVar222._4_4_ * 0.5 * fVar243;
            fVar244 = fVar244 * 1.5 - fVar244 * fVar244 * auVar222._8_4_ * 0.5 * fVar244;
            fVar252 = fVar252 * 1.5 - fVar252 * fVar252 * auVar222._12_4_ * 0.5 * fVar252;
            auVar92._0_4_ = fVar139 * fVar242;
            auVar92._4_4_ = fVar140 * fVar243;
            auVar92._8_4_ = fVar141 * fVar244;
            auVar92._12_4_ = fVar105 * fVar252;
            auVar27._4_4_ = -(uint)(0.9995 < fVar315);
            auVar27._0_4_ = -(uint)(0.9995 < fVar311);
            auVar27._8_4_ = -(uint)(0.9995 < fVar318);
            auVar27._12_4_ = -(uint)(0.9995 < fVar287);
            auVar269 = blendvps(_local_288,auVar92,auVar27);
            auVar209._0_4_ = fVar285 * fVar295 - fVar142 * fVar320 * fVar196;
            auVar209._4_4_ = fVar285 * fVar296 - fVar143 * fVar327 * fVar199;
            auVar209._8_4_ = fVar285 * fVar298 - fVar144 * fVar329 * fVar213;
            auVar209._12_4_ = fVar285 * fVar302 - fVar145 * fVar331 * fVar227;
            auVar73._0_4_ = fVar122 * fVar242;
            auVar73._4_4_ = fVar123 * fVar243;
            auVar73._8_4_ = fVar125 * fVar244;
            auVar73._12_4_ = fVar126 * fVar252;
            auVar108 = blendvps(auVar209,auVar73,auVar27);
            auVar223._0_4_ = fVar195 * fVar295 - fVar185 * fVar320 * fVar196;
            auVar223._4_4_ = fVar195 * fVar296 - fVar186 * fVar327 * fVar199;
            auVar223._8_4_ = fVar195 * fVar298 - fVar188 * fVar329 * fVar213;
            auVar223._12_4_ = fVar195 * fVar302 - fVar194 * fVar331 * fVar227;
            auVar151._0_4_ = fVar198 * fVar242;
            auVar151._4_4_ = fVar212 * fVar243;
            auVar151._8_4_ = fVar214 * fVar244;
            auVar151._12_4_ = fVar228 * fVar252;
            auVar130 = blendvps(auVar223,auVar151,auVar27);
            auVar277._0_4_ = fVar295 * fVar121 - fVar320 * fVar238 * fVar196;
            auVar277._4_4_ = fVar296 * fVar121 - fVar327 * fVar239 * fVar199;
            auVar277._8_4_ = fVar298 * fVar121 - fVar329 * fVar240 * fVar213;
            auVar277._12_4_ = fVar302 * fVar121 - fVar331 * fVar241 * fVar227;
            auVar265._0_4_ = fVar242 * fVar254;
            auVar265._4_4_ = fVar243 * fVar255;
            auVar265._8_4_ = fVar244 * fVar312;
            auVar265._12_4_ = fVar252 * fVar286;
            auVar218 = blendvps(auVar277,auVar265,auVar27);
            local_118._0_4_ = auVar249._0_4_;
            fVar285 = 1.0 - auVar305._0_4_;
            fVar105 = 1.0 - auVar305._4_4_;
            fVar195 = 1.0 - auVar305._8_4_;
            fVar121 = 1.0 - auVar305._12_4_;
            local_298._4_4_ = fVar267 * fVar105 + (float)local_118._0_4_ * auVar305._4_4_;
            local_298._0_4_ = fVar267 * fVar285 + (float)local_118._0_4_ * auVar305._0_4_;
            fStack_290 = fVar267 * fVar195 + (float)local_118._0_4_ * auVar305._8_4_;
            fStack_28c = fVar267 * fVar121 + (float)local_118._0_4_ * auVar305._12_4_;
            local_188._4_4_ = auVar249._4_4_;
            local_268._4_4_ = fVar281 * fVar105 + (float)local_188._4_4_ * auVar305._4_4_;
            local_268._0_4_ = fVar281 * fVar285 + (float)local_188._4_4_ * auVar305._0_4_;
            uStack_260._0_4_ = fVar281 * fVar195 + (float)local_188._4_4_ * auVar305._8_4_;
            uStack_260._4_4_ = fVar281 * fVar121 + (float)local_188._4_4_ * auVar305._12_4_;
            fStack_150 = auVar249._8_4_;
            local_258._4_4_ = fVar283 * fVar105 + fStack_150 * auVar305._4_4_;
            local_258._0_4_ = fVar283 * fVar285 + fStack_150 * auVar305._0_4_;
            uStack_250._0_4_ = fVar283 * fVar195 + fStack_150 * auVar305._8_4_;
            uStack_250._4_4_ = fVar283 * fVar121 + fStack_150 * auVar305._12_4_;
            local_98._0_4_ = auVar232._0_4_;
            local_248._4_4_ = fVar189 * fVar105 + (float)local_98._0_4_ * auVar305._4_4_;
            local_248._0_4_ = fVar189 * fVar285 + (float)local_98._0_4_ * auVar305._0_4_;
            uStack_240._0_4_ = fVar189 * fVar195 + (float)local_98._0_4_ * auVar305._8_4_;
            uStack_240._4_4_ = fVar189 * fVar121 + (float)local_98._0_4_ * auVar305._12_4_;
            local_88._4_4_ = auVar232._4_4_;
            local_1e8._4_4_ = fVar253 * fVar105 + (float)local_88._4_4_ * auVar305._4_4_;
            local_1e8._0_4_ = fVar253 * fVar285 + (float)local_88._4_4_ * auVar305._0_4_;
            fStack_1e0 = fVar253 * fVar195 + (float)local_88._4_4_ * auVar305._8_4_;
            fStack_1dc = fVar253 * fVar121 + (float)local_88._4_4_ * auVar305._12_4_;
            fStack_100 = auVar232._8_4_;
            local_278._4_4_ = fVar187 * fVar105 + fStack_100 * auVar305._4_4_;
            local_278._0_4_ = fVar187 * fVar285 + fStack_100 * auVar305._0_4_;
            uStack_270._0_4_ = fVar187 * fVar195 + fStack_100 * auVar305._8_4_;
            uStack_270._4_4_ = fVar187 * fVar121 + fStack_100 * auVar305._12_4_;
            local_198._0_4_ = auVar205._0_4_;
            local_2a8._4_4_ = fVar197 * fVar105 + (float)local_198._0_4_ * auVar305._4_4_;
            local_2a8._0_4_ = fVar197 * fVar285 + (float)local_198._0_4_ * auVar305._0_4_;
            fStack_2a0 = fVar197 * fVar195 + (float)local_198._0_4_ * auVar305._8_4_;
            fStack_29c = fVar197 * fVar121 + (float)local_198._0_4_ * auVar305._12_4_;
            local_168._4_4_ = auVar205._4_4_;
            fStack_f0 = auVar205._8_4_;
            local_1a8._0_4_ = auVar263._0_4_;
            local_178._4_4_ = auVar263._4_4_;
            fStack_140 = auVar263._8_4_;
            local_1c8._4_4_ = fVar120 * fVar105 + (float)local_168._4_4_ * auVar305._4_4_;
            local_1c8._0_4_ = fVar120 * fVar285 + (float)local_168._4_4_ * auVar305._0_4_;
            fStack_1c0 = fVar120 * fVar195 + (float)local_168._4_4_ * auVar305._8_4_;
            fStack_1bc = fVar120 * fVar121 + (float)local_168._4_4_ * auVar305._12_4_;
            local_1d8._4_4_ = fVar124 * fVar105 + fStack_f0 * auVar305._4_4_;
            local_1d8._0_4_ = fVar124 * fVar285 + fStack_f0 * auVar305._0_4_;
            fStack_1d0 = fVar124 * fVar195 + fStack_f0 * auVar305._8_4_;
            fStack_1cc = fVar124 * fVar121 + fStack_f0 * auVar305._12_4_;
            local_208._4_4_ = fVar106 * fVar105 + (float)local_1a8._0_4_ * auVar305._4_4_;
            local_208._0_4_ = fVar106 * fVar285 + (float)local_1a8._0_4_ * auVar305._0_4_;
            uStack_200._0_4_ = fVar106 * fVar195 + (float)local_1a8._0_4_ * auVar305._8_4_;
            uStack_200._4_4_ = fVar106 * fVar121 + (float)local_1a8._0_4_ * auVar305._12_4_;
            local_1b8._4_4_ = fVar119 * fVar105 + (float)local_178._4_4_ * auVar305._4_4_;
            local_1b8._0_4_ = fVar119 * fVar285 + (float)local_178._4_4_ * auVar305._0_4_;
            fStack_1b0 = fVar119 * fVar195 + (float)local_178._4_4_ * auVar305._8_4_;
            fStack_1ac = fVar119 * fVar121 + (float)local_178._4_4_ * auVar305._12_4_;
            local_218._4_4_ = fVar105 * fVar79 + fStack_140 * auVar305._4_4_;
            local_218._0_4_ = fVar285 * fVar79 + fStack_140 * auVar305._0_4_;
            fStack_210 = fVar195 * fVar79 + fStack_140 * auVar305._8_4_;
            fStack_20c = fVar121 * fVar79 + fStack_140 * auVar305._12_4_;
            fVar197 = auVar108._0_4_;
            fVar120 = auVar108._4_4_;
            fVar121 = auVar108._12_4_;
            local_288._0_4_ = auVar269._0_4_;
            local_288._4_4_ = auVar269._4_4_;
            fStack_280 = auVar269._8_4_;
            fStack_27c = auVar269._12_4_;
            fVar124 = auVar108._8_4_;
            fVar140 = auVar130._0_4_;
            fVar142 = auVar130._4_4_;
            fVar144 = auVar130._8_4_;
            fVar185 = auVar130._12_4_;
            fVar105 = auVar218._0_4_;
            fVar119 = auVar218._4_4_;
            fVar189 = auVar218._8_4_;
            fVar187 = auVar218._12_4_;
            fVar267 = fVar197 * fVar140 + (float)local_288._0_4_ * fVar105;
            fVar281 = fVar120 * fVar142 + (float)local_288._4_4_ * fVar119;
            fVar283 = fVar124 * fVar144 + fStack_280 * fVar189;
            fVar285 = fVar121 * fVar185 + fStack_27c * fVar187;
            fVar239 = fVar197 * fVar140 - (float)local_288._0_4_ * fVar105;
            fVar240 = fVar120 * fVar142 - (float)local_288._4_4_ * fVar119;
            fVar241 = fVar124 * fVar144 - fStack_280 * fVar189;
            fVar242 = fVar121 * fVar185 - fStack_27c * fVar187;
            fVar198 = fVar140 * fVar140;
            fVar199 = fVar142 * fVar142;
            fVar212 = fVar144 * fVar144;
            fVar213 = fVar185 * fVar185;
            fVar106 = (float)local_288._0_4_ * (float)local_288._0_4_ - fVar197 * fVar197;
            fVar79 = (float)local_288._4_4_ * (float)local_288._4_4_ - fVar120 * fVar120;
            fVar253 = fStack_280 * fStack_280 - fVar124 * fVar124;
            fVar195 = fStack_27c * fStack_27c - fVar121 * fVar121;
            fVar139 = fVar197 * fVar105 - (float)local_288._0_4_ * fVar140;
            fVar141 = fVar120 * fVar119 - (float)local_288._4_4_ * fVar142;
            fVar143 = fVar124 * fVar189 - fStack_280 * fVar144;
            fVar145 = fVar121 * fVar187 - fStack_27c * fVar185;
            fVar122 = (float)local_288._0_4_ * fVar140 + fVar197 * fVar105;
            fVar123 = (float)local_288._4_4_ * fVar142 + fVar120 * fVar119;
            fVar125 = fStack_280 * fVar144 + fVar124 * fVar189;
            fVar126 = fStack_27c * fVar185 + fVar121 * fVar187;
            fVar186 = fVar105 * fVar140 + fVar197 * (float)local_288._0_4_;
            fVar188 = fVar119 * fVar142 + fVar120 * (float)local_288._4_4_;
            fVar194 = fVar189 * fVar144 + fVar124 * fStack_280;
            fVar196 = fVar187 * fVar185 + fVar121 * fStack_27c;
            fVar140 = fVar105 * fVar140 - fVar197 * (float)local_288._0_4_;
            fVar142 = fVar119 * fVar142 - fVar120 * (float)local_288._4_4_;
            fVar144 = fVar189 * fVar144 - fVar124 * fStack_280;
            fVar185 = fVar187 * fVar185 - fVar121 * fStack_27c;
            fVar105 = fVar105 * fVar105;
            fVar119 = fVar119 * fVar119;
            fVar189 = fVar189 * fVar189;
            fVar187 = fVar187 * fVar187;
            fVar214 = (((float)local_288._0_4_ * (float)local_288._0_4_ + fVar197 * fVar197) -
                      fVar198) - fVar105;
            fVar227 = (((float)local_288._4_4_ * (float)local_288._4_4_ + fVar120 * fVar120) -
                      fVar199) - fVar119;
            fVar228 = ((fStack_280 * fStack_280 + fVar124 * fVar124) - fVar212) - fVar189;
            fVar238 = ((fStack_27c * fStack_27c + fVar121 * fVar121) - fVar213) - fVar187;
            fVar197 = (fVar198 + fVar106) - fVar105;
            fVar120 = (fVar199 + fVar79) - fVar119;
            fVar124 = (fVar212 + fVar253) - fVar189;
            fVar121 = (fVar213 + fVar195) - fVar187;
            fVar105 = (fVar106 - fVar198) + fVar105;
            fVar119 = (fVar79 - fVar199) + fVar119;
            fVar189 = (fVar253 - fVar212) + fVar189;
            fVar187 = (fVar195 - fVar213) + fVar187;
          }
          else {
            while (uVar10 = movmskps((int)pRVar12,_local_2b8), uVar10 != 0) {
              lVar14 = 0;
              if ((uVar10 & 0xff) != 0) {
                for (; ((uVar10 & 0xff) >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
                }
              }
              iVar13 = *(int *)((long)&local_78 + (long)(int)lVar14 * 4);
              auVar29._0_4_ = -(uint)(iVar13 == iVar301);
              auVar29._4_4_ = -(uint)(iVar13 == iVar310);
              auVar29._8_4_ = -(uint)(iVar13 == iVar314);
              auVar29._12_4_ = -(uint)(iVar13 == iVar317);
              auVar29 = auVar29 & _local_2b8;
              pRVar7 = (this_00->l2w_buf).items;
              pRVar12 = pRVar7 + iVar13;
              RVar3 = pRVar7[iVar13].format;
              if (RVar3 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
                pcVar6 = pRVar12->ptr_ofs;
                lVar14 = pRVar12->stride * uVar16;
                auVar108 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar14)),
                                    *(undefined4 *)(pcVar6 + lVar14 + 0x10),0x1c);
                auVar323 = insertps(auVar108,*(undefined4 *)(pcVar6 + lVar14 + 0x20),0x28);
                auVar108 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar14 + 4)),
                                    *(undefined4 *)(pcVar6 + lVar14 + 0x14),0x1c);
                in_XMM4 = insertps(auVar108,*(undefined4 *)(pcVar6 + lVar14 + 0x24),0x28);
                auVar108 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar14 + 8)),
                                    *(undefined4 *)(pcVar6 + lVar14 + 0x18),0x1c);
                local_e8 = insertps(auVar108,*(undefined4 *)(pcVar6 + lVar14 + 0x28),0x28);
                auVar108 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar14 + 0xc)),
                                    *(undefined4 *)(pcVar6 + lVar14 + 0x1c),0x1c);
                in_XMM8 = insertps(auVar108,*(undefined4 *)(pcVar6 + lVar14 + 0x2c),0x28);
              }
              else if (RVar3 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
                pcVar6 = pRVar12->ptr_ofs;
                lVar14 = pRVar12->stride * uVar16;
                auVar323._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar14 + 4);
                auVar323._0_4_ = *(undefined4 *)(pcVar6 + lVar14);
                auVar323._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar14 + 4) >> 0x20);
                auVar323._12_4_ = 0;
                in_XMM4._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar14 + 0x10);
                in_XMM4._0_4_ = *(undefined4 *)(pcVar6 + lVar14 + 0xc);
                in_XMM4._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar14 + 0x10) >> 0x20);
                in_XMM4._12_4_ = 0;
                local_e8._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar14 + 0x1c);
                local_e8._0_4_ = *(undefined4 *)(pcVar6 + lVar14 + 0x18);
                local_e8._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar14 + 0x1c) >> 0x20);
                local_e8._12_4_ = 0;
                in_XMM8._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar14 + 0x28);
                in_XMM8._0_4_ = *(undefined4 *)(pcVar6 + lVar14 + 0x24);
                in_XMM8._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar14 + 0x28) >> 0x20);
                in_XMM8._12_4_ = 0;
              }
              else if (RVar3 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
                pcVar6 = pRVar12->ptr_ofs;
                lVar14 = pRVar12->stride * uVar16;
                auVar74._8_8_ = 0;
                auVar74._0_8_ = *(ulong *)(pcVar6 + lVar14 + 0x10);
                auVar108 = insertps(auVar74,*(undefined4 *)(pcVar6 + lVar14 + 8),0x20);
                auVar278._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar14 + 0x34);
                auVar278._0_4_ = *(undefined4 *)(pcVar6 + lVar14);
                auVar278._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar14 + 0x34) >> 0x20);
                auVar278._12_4_ = 0;
                auVar225._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar14 + 0x1c);
                auVar225._0_4_ = *(undefined4 *)(pcVar6 + lVar14 + 0x18);
                auVar225._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar14 + 0x1c) >> 0x20);
                auVar225._12_4_ = 0;
                fVar267 = *(float *)(pcVar6 + lVar14 + 0x24);
                fVar281 = *(float *)(pcVar6 + lVar14 + 0x28);
                fVar283 = *(float *)(pcVar6 + lVar14 + 0x2c);
                fVar285 = *(float *)(pcVar6 + lVar14 + 0x30);
                fVar106 = fVar285 * fVar285 +
                          fVar283 * fVar283 + fVar267 * fVar267 + fVar281 * fVar281;
                auVar130 = rsqrtss(ZEXT416((uint)fVar106),ZEXT416((uint)fVar106));
                fVar105 = auVar130._0_4_;
                fVar105 = fVar105 * fVar105 * fVar106 * -0.5 * fVar105 + fVar105 * 1.5;
                in_XMM8 = insertps(auVar225,ZEXT416((uint)(fVar267 * fVar105)),0x30);
                auVar323 = insertps(auVar278,ZEXT416((uint)(fVar281 * fVar105)),0x30);
                auVar292._0_4_ = fVar105 * fVar285;
                auVar292._4_12_ = auVar130._4_12_;
                auVar130 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar14 + 0xc)),
                                    *(undefined4 *)(pcVar6 + lVar14 + 4),0x10);
                local_e8 = insertps(auVar108,auVar292,0x30);
                auVar108 = insertps(auVar130,*(undefined4 *)(pcVar6 + lVar14 + 0x3c),0x20);
                in_XMM4 = insertps(auVar108,ZEXT416((uint)(fVar283 * fVar105)),0x30);
              }
              else if (RVar3 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
                pcVar6 = pRVar12->ptr_ofs;
                lVar14 = pRVar12->stride * uVar16;
                auVar323 = *(undefined1 (*) [16])(pcVar6 + lVar14);
                in_XMM4 = *(undefined1 (*) [16])(pcVar6 + lVar14 + 0x10);
                local_e8 = *(undefined1 (*) [16])(pcVar6 + lVar14 + 0x20);
                in_XMM8 = *(undefined1 (*) [16])(pcVar6 + lVar14 + 0x30);
              }
              uVar80 = auVar323._0_4_;
              uVar102 = auVar323._4_4_;
              uVar103 = auVar323._8_4_;
              uVar104 = auVar323._12_4_;
              auVar153._4_4_ = uVar80;
              auVar153._0_4_ = uVar80;
              auVar153._8_4_ = uVar80;
              auVar153._12_4_ = uVar80;
              _local_298 = blendvps(_local_298,auVar153,auVar29);
              auVar154._4_4_ = uVar102;
              auVar154._0_4_ = uVar102;
              auVar154._8_4_ = uVar102;
              auVar154._12_4_ = uVar102;
              _local_268 = blendvps(_local_268,auVar154,auVar29);
              auVar155._4_4_ = uVar103;
              auVar155._0_4_ = uVar103;
              auVar155._8_4_ = uVar103;
              auVar155._12_4_ = uVar103;
              _local_258 = blendvps(_local_258,auVar155,auVar29);
              auVar156._4_4_ = uVar104;
              auVar156._0_4_ = uVar104;
              auVar156._8_4_ = uVar104;
              auVar156._12_4_ = uVar104;
              _local_238 = blendvps(_local_238,auVar156,auVar29);
              uVar80 = in_XMM4._0_4_;
              uVar102 = in_XMM4._4_4_;
              uVar103 = in_XMM4._8_4_;
              uVar104 = in_XMM4._12_4_;
              auVar157._4_4_ = uVar80;
              auVar157._0_4_ = uVar80;
              auVar157._8_4_ = uVar80;
              auVar157._12_4_ = uVar80;
              _local_248 = blendvps(_local_248,auVar157,auVar29);
              auVar158._4_4_ = uVar102;
              auVar158._0_4_ = uVar102;
              auVar158._8_4_ = uVar102;
              auVar158._12_4_ = uVar102;
              _local_1e8 = blendvps(_local_1e8,auVar158,auVar29);
              auVar159._4_4_ = uVar103;
              auVar159._0_4_ = uVar103;
              auVar159._8_4_ = uVar103;
              auVar159._12_4_ = uVar103;
              _local_278 = blendvps(_local_278,auVar159,auVar29);
              auVar160._4_4_ = uVar104;
              auVar160._0_4_ = uVar104;
              auVar160._8_4_ = uVar104;
              auVar160._12_4_ = uVar104;
              _local_1f8 = blendvps(_local_1f8,auVar160,auVar29);
              auVar161._4_4_ = local_e8._0_4_;
              auVar161._0_4_ = local_e8._0_4_;
              auVar161._8_4_ = local_e8._0_4_;
              auVar161._12_4_ = local_e8._0_4_;
              _local_2a8 = blendvps(_local_2a8,auVar161,auVar29);
              auVar162._4_4_ = local_e8._4_4_;
              auVar162._0_4_ = local_e8._4_4_;
              auVar162._8_4_ = local_e8._4_4_;
              auVar162._12_4_ = local_e8._4_4_;
              _local_1c8 = blendvps(_local_1c8,auVar162,auVar29);
              auVar163._4_4_ = local_e8._8_4_;
              auVar163._0_4_ = local_e8._8_4_;
              auVar163._8_4_ = local_e8._8_4_;
              auVar163._12_4_ = local_e8._8_4_;
              _local_1d8 = blendvps(_local_1d8,auVar163,auVar29);
              auVar164._4_4_ = local_e8._12_4_;
              auVar164._0_4_ = local_e8._12_4_;
              auVar164._8_4_ = local_e8._12_4_;
              auVar164._12_4_ = local_e8._12_4_;
              _local_228 = blendvps(_local_228,auVar164,auVar29);
              uVar80 = in_XMM8._0_4_;
              uVar102 = in_XMM8._4_4_;
              uVar103 = in_XMM8._8_4_;
              uVar104 = in_XMM8._12_4_;
              auVar165._4_4_ = uVar80;
              auVar165._0_4_ = uVar80;
              auVar165._8_4_ = uVar80;
              auVar165._12_4_ = uVar80;
              _local_208 = blendvps(_local_208,auVar165,auVar29);
              auVar166._4_4_ = uVar102;
              auVar166._0_4_ = uVar102;
              auVar166._8_4_ = uVar102;
              auVar166._12_4_ = uVar102;
              _local_1b8 = blendvps(_local_1b8,auVar166,auVar29);
              auVar167._4_4_ = uVar103;
              auVar167._0_4_ = uVar103;
              auVar167._8_4_ = uVar103;
              auVar167._12_4_ = uVar103;
              _local_198 = blendvps(_local_198,auVar167,auVar29);
              auVar168._4_4_ = uVar104;
              auVar168._0_4_ = uVar104;
              auVar168._8_4_ = uVar104;
              auVar168._12_4_ = uVar104;
              _local_178 = blendvps(_local_178,auVar168,auVar29);
              RVar3 = pRVar12[1].format;
              if (RVar3 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
                pcVar6 = pRVar12[1].ptr_ofs;
                pRVar12 = (RawBufferView *)(pRVar12[1].stride * uVar16);
                auVar269 = insertps(ZEXT416(*(uint *)((long)&pRVar12->ptr_ofs + (long)pcVar6)),
                                    *(undefined4 *)((long)&pRVar12->stride + (long)pcVar6),0x1c);
                in_XMM11 = insertps(auVar269,*(undefined4 *)((long)&pRVar12->format + (long)pcVar6),
                                    0x28);
                auVar269 = insertps(ZEXT416(*(uint *)((long)&pRVar12->ptr_ofs + (long)(pcVar6 + 4)))
                                    ,*(undefined4 *)((long)&pRVar12->stride + (long)(pcVar6 + 4)),
                                    0x1c);
                in_XMM14 = insertps(auVar269,*(undefined4 *)
                                              ((long)&pRVar12->modCounter + (long)pcVar6),0x28);
                auVar269 = insertps(ZEXT416(*(uint *)((long)&pRVar12->dptr_ofs + (long)pcVar6)),
                                    *(undefined4 *)((long)&pRVar12->num + (long)pcVar6),0x1c);
                local_d8 = insertps(auVar269,*(undefined4 *)(&pRVar12->modified + (long)pcVar6),0x28
                                   );
                auVar269 = insertps(ZEXT416(*(uint *)((long)&pRVar12->dptr_ofs + (long)(pcVar6 + 4))
                                           ),*(undefined4 *)
                                              ((long)&pRVar12->num + (long)(pcVar6 + 4)),0x1c);
                auVar269 = insertps(auVar269,*(undefined4 *)
                                              ((long)&pRVar12->userData + (long)pcVar6),0x28);
              }
              else if (RVar3 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
                pcVar6 = pRVar12[1].ptr_ofs;
                pRVar12 = (RawBufferView *)(pRVar12[1].stride * uVar16);
                uVar2 = *(undefined8 *)((long)&pRVar12->ptr_ofs + (long)(pcVar6 + 4));
                in_XMM11._4_4_ = (int)uVar2;
                in_XMM11._0_4_ = *(undefined4 *)((long)&pRVar12->ptr_ofs + (long)pcVar6);
                in_XMM11._8_4_ = (int)((ulong)uVar2 >> 0x20);
                in_XMM11._12_4_ = 0;
                uVar2 = *(undefined8 *)((long)&pRVar12->stride + (long)pcVar6);
                in_XMM14._4_4_ = (int)uVar2;
                in_XMM14._0_4_ = *(undefined4 *)((long)&pRVar12->dptr_ofs + (long)(pcVar6 + 4));
                in_XMM14._8_4_ = (int)((ulong)uVar2 >> 0x20);
                in_XMM14._12_4_ = 0;
                uVar2 = *(undefined8 *)((long)&pRVar12->num + (long)(pcVar6 + 4));
                local_d8._4_4_ = (int)uVar2;
                local_d8._0_4_ = *(undefined4 *)((long)&pRVar12->num + (long)pcVar6);
                local_d8._8_4_ = (int)((ulong)uVar2 >> 0x20);
                local_d8._12_4_ = 0;
                auVar269._4_4_ = (int)*(undefined8 *)(&pRVar12->modified + (long)pcVar6);
                auVar269._0_4_ = (float)*(undefined4 *)((long)&pRVar12->modCounter + (long)pcVar6);
                auVar269._8_4_ =
                     (int)((ulong)*(undefined8 *)(&pRVar12->modified + (long)pcVar6) >> 0x20);
                auVar269._12_4_ = 0;
              }
              else if (RVar3 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
                pcVar6 = pRVar12[1].ptr_ofs;
                pRVar12 = (RawBufferView *)(pRVar12[1].stride * uVar16);
                auVar75._8_8_ = 0;
                auVar75._0_8_ = *(ulong *)((long)&pRVar12->stride + (long)pcVar6);
                auVar108 = insertps(auVar75,*(undefined4 *)((long)&pRVar12->dptr_ofs + (long)pcVar6)
                                    ,0x20);
                auVar266._4_4_ = (int)*(undefined8 *)(pcVar6 + 4 + (long)&(pRVar12->buffer).ptr);
                auVar266._0_4_ = *(undefined4 *)((long)&pRVar12->ptr_ofs + (long)pcVar6);
                auVar266._8_4_ =
                     (int)((ulong)*(undefined8 *)(pcVar6 + 4 + (long)&(pRVar12->buffer).ptr) >> 0x20
                          );
                auVar266._12_4_ = 0;
                uVar2 = *(undefined8 *)((long)&pRVar12->num + (long)(pcVar6 + 4));
                auVar93._4_4_ = (int)uVar2;
                auVar93._0_4_ = *(undefined4 *)((long)&pRVar12->num + (long)pcVar6);
                auVar93._8_4_ = (int)((ulong)uVar2 >> 0x20);
                auVar93._12_4_ = 0;
                fVar267 = *(float *)((long)&pRVar12->modCounter + (long)pcVar6);
                fVar281 = *(float *)(&pRVar12->modified + (long)pcVar6);
                fVar283 = *(float *)((long)&pRVar12->userData + (long)pcVar6);
                fVar285 = *(float *)(pcVar6 + (long)&(pRVar12->buffer).ptr);
                fVar106 = fVar285 * fVar285 +
                          fVar283 * fVar283 + fVar267 * fVar267 + fVar281 * fVar281;
                auVar130 = rsqrtss(ZEXT416((uint)fVar106),ZEXT416((uint)fVar106));
                fVar105 = auVar130._0_4_;
                fVar105 = fVar105 * fVar105 * fVar106 * -0.5 * fVar105 + fVar105 * 1.5;
                auVar269 = insertps(auVar93,ZEXT416((uint)(fVar267 * fVar105)),0x30);
                in_XMM11 = insertps(auVar266,ZEXT416((uint)(fVar281 * fVar105)),0x30);
                auVar293._0_4_ = fVar105 * fVar285;
                auVar293._4_12_ = auVar130._4_12_;
                auVar130 = insertps(ZEXT416(*(uint *)((long)&pRVar12->dptr_ofs + (long)(pcVar6 + 4))
                                           ),*(undefined4 *)
                                              ((long)&pRVar12->ptr_ofs + (long)(pcVar6 + 4)),0x10);
                local_d8 = insertps(auVar108,auVar293,0x30);
                auVar108 = insertps(auVar130,*(undefined4 *)
                                              ((long)&pRVar12[1].ptr_ofs + (long)(pcVar6 + 4)),0x20)
                ;
                in_XMM14 = insertps(auVar108,ZEXT416((uint)(fVar283 * fVar105)),0x30);
              }
              else if (RVar3 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
                pcVar6 = pRVar12[1].ptr_ofs;
                pRVar12 = (RawBufferView *)(pRVar12[1].stride * uVar16);
                in_XMM11 = *(undefined1 (*) [16])((long)&pRVar12->ptr_ofs + (long)pcVar6);
                in_XMM14 = *(undefined1 (*) [16])((long)&pRVar12->stride + (long)pcVar6);
                local_d8 = *(undefined1 (*) [16])((long)&pRVar12->format + (long)pcVar6);
                auVar269 = *(undefined1 (*) [16])(pcVar6 + (long)&(pRVar12->buffer).ptr);
              }
              uVar80 = in_XMM11._0_4_;
              uVar102 = in_XMM11._4_4_;
              uVar103 = in_XMM11._8_4_;
              uVar104 = in_XMM11._12_4_;
              auVar169._4_4_ = uVar80;
              auVar169._0_4_ = uVar80;
              auVar169._8_4_ = uVar80;
              auVar169._12_4_ = uVar80;
              _local_c8 = blendvps(_local_c8,auVar169,auVar29);
              auVar170._4_4_ = uVar102;
              auVar170._0_4_ = uVar102;
              auVar170._8_4_ = uVar102;
              auVar170._12_4_ = uVar102;
              _local_b8 = blendvps(_local_b8,auVar170,auVar29);
              auVar171._4_4_ = uVar103;
              auVar171._0_4_ = uVar103;
              auVar171._8_4_ = uVar103;
              auVar171._12_4_ = uVar103;
              _local_a8 = blendvps(_local_a8,auVar171,auVar29);
              auVar172._4_4_ = uVar104;
              auVar172._0_4_ = uVar104;
              auVar172._8_4_ = uVar104;
              auVar172._12_4_ = uVar104;
              _local_1a8 = blendvps(_local_1a8,auVar172,auVar29);
              uVar80 = in_XMM14._0_4_;
              uVar102 = in_XMM14._4_4_;
              uVar103 = in_XMM14._8_4_;
              uVar104 = in_XMM14._12_4_;
              auVar173._4_4_ = uVar80;
              auVar173._0_4_ = uVar80;
              auVar173._8_4_ = uVar80;
              auVar173._12_4_ = uVar80;
              _local_98 = blendvps(_local_98,auVar173,auVar29);
              auVar174._4_4_ = uVar102;
              auVar174._0_4_ = uVar102;
              auVar174._8_4_ = uVar102;
              auVar174._12_4_ = uVar102;
              _local_88 = blendvps(_local_88,auVar174,auVar29);
              auVar175._4_4_ = uVar103;
              auVar175._0_4_ = uVar103;
              auVar175._8_4_ = uVar103;
              auVar175._12_4_ = uVar103;
              _local_118 = blendvps(_local_118,auVar175,auVar29);
              auVar176._4_4_ = uVar104;
              auVar176._0_4_ = uVar104;
              auVar176._8_4_ = uVar104;
              auVar176._12_4_ = uVar104;
              _local_218 = blendvps(_local_218,auVar176,auVar29);
              auVar177._4_4_ = local_d8._0_4_;
              auVar177._0_4_ = local_d8._0_4_;
              auVar177._8_4_ = local_d8._0_4_;
              auVar177._12_4_ = local_d8._0_4_;
              _local_108 = blendvps(_local_108,auVar177,auVar29);
              auVar178._4_4_ = local_d8._4_4_;
              auVar178._0_4_ = local_d8._4_4_;
              auVar178._8_4_ = local_d8._4_4_;
              auVar178._12_4_ = local_d8._4_4_;
              _local_188 = blendvps(_local_188,auVar178,auVar29);
              auVar179._4_4_ = local_d8._8_4_;
              auVar179._0_4_ = local_d8._8_4_;
              auVar179._8_4_ = local_d8._8_4_;
              auVar179._12_4_ = local_d8._8_4_;
              _local_f8 = blendvps(_local_f8,auVar179,auVar29);
              auVar180._4_4_ = local_d8._12_4_;
              auVar180._0_4_ = local_d8._12_4_;
              auVar180._8_4_ = local_d8._12_4_;
              auVar180._12_4_ = local_d8._12_4_;
              _local_288 = blendvps(_local_288,auVar180,auVar29);
              uVar80 = auVar269._0_4_;
              uVar102 = auVar269._4_4_;
              uVar103 = auVar269._8_4_;
              uVar104 = auVar269._12_4_;
              auVar181._4_4_ = uVar80;
              auVar181._0_4_ = uVar80;
              auVar181._8_4_ = uVar80;
              auVar181._12_4_ = uVar80;
              _local_168 = blendvps(_local_168,auVar181,auVar29);
              auVar182._4_4_ = uVar102;
              auVar182._0_4_ = uVar102;
              auVar182._8_4_ = uVar102;
              auVar182._12_4_ = uVar102;
              _local_158 = blendvps(_local_158,auVar182,auVar29);
              auVar183._4_4_ = uVar103;
              auVar183._0_4_ = uVar103;
              auVar183._8_4_ = uVar103;
              auVar183._12_4_ = uVar103;
              _local_148 = blendvps(_local_148,auVar183,auVar29);
              auVar184._4_4_ = uVar104;
              auVar184._0_4_ = uVar104;
              auVar184._8_4_ = uVar104;
              auVar184._12_4_ = uVar104;
              local_128 = blendvps(local_128,auVar184,auVar29);
              _local_2b8 = _local_2b8 ^ auVar29;
            }
            auVar114._0_4_ =
                 local_288._0_4_ * (float)local_228._0_4_ +
                 local_218._0_4_ * (float)local_1f8._0_4_ +
                 local_1a8._0_4_ * (float)local_238._0_4_ + local_128._0_4_ * (float)local_178._0_4_
            ;
            auVar114._4_4_ =
                 local_288._4_4_ * (float)local_228._4_4_ +
                 local_218._4_4_ * (float)local_1f8._4_4_ +
                 local_1a8._4_4_ * (float)local_238._4_4_ + local_128._4_4_ * (float)local_178._4_4_
            ;
            auVar114._8_4_ =
                 local_288._8_4_ * fStack_220 +
                 local_218._8_4_ * fStack_1f0 +
                 local_1a8._8_4_ * fStack_230 + local_128._8_4_ * fStack_170;
            auVar114._12_4_ =
                 local_288._12_4_ * fStack_21c +
                 local_218._12_4_ * fStack_1ec +
                 local_1a8._12_4_ * fStack_22c + local_128._12_4_ * fStack_16c;
            uVar16 = CONCAT44(auVar114._4_4_,auVar114._0_4_);
            auVar236._0_8_ = uVar16 ^ 0x8000000080000000;
            auVar236._8_4_ = -auVar114._8_4_;
            auVar236._12_4_ = -auVar114._12_4_;
            auVar30._4_4_ = -(uint)(auVar114._4_4_ < -auVar114._4_4_);
            auVar30._0_4_ = -(uint)(auVar114._0_4_ < -auVar114._0_4_);
            auVar30._8_4_ = -(uint)(auVar114._8_4_ < auVar236._8_4_);
            auVar30._12_4_ = -(uint)(auVar114._12_4_ < auVar236._12_4_);
            auVar94._0_8_ = local_128._0_8_ ^ 0x8000000080000000;
            auVar94._8_4_ = -local_128._8_4_;
            auVar94._12_4_ = -local_128._12_4_;
            auVar323 = blendvps(local_128,auVar94,auVar30);
            auVar95._0_8_ = local_1a8 ^ 0x8000000080000000;
            auVar95._8_4_ = -local_1a8._8_4_;
            auVar95._12_4_ = -local_1a8._12_4_;
            auVar326 = blendvps(_local_1a8,auVar95,auVar30);
            auVar96._0_8_ = local_218 ^ 0x8000000080000000;
            auVar96._8_4_ = -local_218._8_4_;
            auVar96._12_4_ = -local_218._12_4_;
            auVar130 = blendvps(_local_218,auVar96,auVar30);
            auVar97._0_8_ = local_288 ^ 0x8000000080000000;
            auVar97._8_4_ = -local_288._8_4_;
            auVar97._12_4_ = -local_288._12_4_;
            auVar108 = blendvps(_local_288,auVar97,auVar30);
            auVar218 = maxps(auVar236,auVar114);
            fVar267 = ABS(auVar114._0_4_);
            fVar281 = ABS(auVar114._4_4_);
            uVar16 = CONCAT44(auVar114._4_4_,auVar114._0_4_);
            auVar115._0_8_ = uVar16 & 0x7fffffff7fffffff;
            auVar115._8_4_ = ABS(auVar114._8_4_);
            auVar115._12_4_ = ABS(auVar114._12_4_);
            auVar98._0_4_ = 1.0 - fVar267;
            auVar98._4_4_ = 1.0 - fVar281;
            auVar98._8_4_ = 1.0 - auVar115._8_4_;
            auVar98._12_4_ = 1.0 - auVar115._12_4_;
            auVar269 = sqrtps(auVar98,auVar98);
            auVar31._0_4_ =
                 1.5707964 -
                 auVar269._0_4_ *
                 (((((fVar267 * -0.0043095737 + 0.0192803) * fVar267 + -0.04489909) * fVar267 +
                   0.08785567) * fVar267 + -0.21450998) * fVar267 + 1.5707952);
            auVar31._4_4_ =
                 1.5707964 -
                 auVar269._4_4_ *
                 (((((fVar281 * -0.0043095737 + 0.0192803) * fVar281 + -0.04489909) * fVar281 +
                   0.08785567) * fVar281 + -0.21450998) * fVar281 + 1.5707952);
            auVar31._8_4_ =
                 1.5707964 -
                 auVar269._8_4_ *
                 (((((auVar115._8_4_ * -0.0043095737 + 0.0192803) * auVar115._8_4_ + -0.04489909) *
                    auVar115._8_4_ + 0.08785567) * auVar115._8_4_ + -0.21450998) * auVar115._8_4_ +
                 1.5707952);
            auVar31._12_4_ =
                 1.5707964 -
                 auVar269._12_4_ *
                 (((((auVar115._12_4_ * -0.0043095737 + 0.0192803) * auVar115._12_4_ + -0.04489909)
                    * auVar115._12_4_ + 0.08785567) * auVar115._12_4_ + -0.21450998) *
                  auVar115._12_4_ + 1.5707952);
            auVar269 = maxps(ZEXT816(0),auVar31);
            fVar186 = auVar218._0_4_;
            fVar188 = auVar218._4_4_;
            fVar194 = auVar218._8_4_;
            fVar196 = auVar218._12_4_;
            auVar32._4_4_ = -(uint)(fVar188 < 0.0);
            auVar32._0_4_ = -(uint)(fVar186 < 0.0);
            auVar32._8_4_ = -(uint)(fVar194 < 0.0);
            auVar32._12_4_ = -(uint)(fVar196 < 0.0);
            auVar99._0_8_ = auVar269._0_8_ ^ 0x8000000080000000;
            auVar99._8_4_ = auVar269._8_4_ ^ 0x80000000;
            auVar99._12_4_ = auVar269._12_4_ ^ 0x80000000;
            auVar269 = blendvps(auVar269,auVar99,auVar32);
            auVar100._0_4_ = 1.5707964 - auVar269._0_4_;
            auVar100._4_4_ = 1.5707964 - auVar269._4_4_;
            auVar100._8_4_ = 1.5707964 - auVar269._8_4_;
            auVar100._12_4_ = 1.5707964 - auVar269._12_4_;
            auVar33._4_4_ = -(uint)(1.0 < fVar281);
            auVar33._0_4_ = -(uint)(1.0 < fVar267);
            auVar33._8_4_ = -(uint)(1.0 < auVar115._8_4_);
            auVar33._12_4_ = -(uint)(1.0 < auVar115._12_4_);
            auVar269 = blendvps(auVar100,_DAT_01f4bc50,auVar33);
            fVar267 = auVar269._0_4_ * auVar305._0_4_;
            fVar281 = auVar269._4_4_ * auVar305._4_4_;
            fVar283 = auVar269._8_4_ * auVar305._8_4_;
            fVar285 = auVar269._12_4_ * auVar305._12_4_;
            auVar34._0_4_ = fVar267 * 0.63661975;
            auVar34._4_4_ = fVar281 * 0.63661975;
            auVar34._8_4_ = fVar283 * 0.63661975;
            auVar34._12_4_ = fVar285 * 0.63661975;
            auVar269 = roundps(auVar115,auVar34,1);
            uVar10 = (uint)auVar269._0_4_;
            uVar38 = (uint)auVar269._4_4_;
            uVar39 = (uint)auVar269._8_4_;
            uVar43 = (uint)auVar269._12_4_;
            fVar267 = fVar267 - auVar269._0_4_ * 1.5707964;
            fVar281 = fVar281 - auVar269._4_4_ * 1.5707964;
            fVar283 = fVar283 - auVar269._8_4_ * 1.5707964;
            fVar285 = fVar285 - auVar269._12_4_ * 1.5707964;
            uVar37 = uVar10 & 3;
            uVar42 = uVar38 & 3;
            uVar40 = uVar39 & 3;
            uVar44 = uVar43 & 3;
            fVar105 = fVar267 * fVar267;
            fVar106 = fVar281 * fVar281;
            fVar119 = fVar283 * fVar283;
            fVar79 = fVar285 * fVar285;
            uVar10 = uVar10 & 1;
            uVar38 = uVar38 & 1;
            uVar39 = uVar39 & 1;
            uVar43 = uVar43 & 1;
            auVar137._0_4_ = -(uint)(uVar10 == 0);
            auVar137._4_4_ = -(uint)(uVar38 == 0);
            auVar137._8_4_ = -(uint)(uVar39 == 0);
            auVar137._12_4_ = -(uint)(uVar43 == 0);
            auVar226._4_4_ = -uVar38;
            auVar226._0_4_ = -uVar10;
            auVar226._8_4_ = -uVar39;
            auVar226._12_4_ = -uVar43;
            auVar279._0_8_ =
                 CONCAT44((((((fVar106 * -2.5029328e-08 + 2.7600126e-06) * fVar106 + -0.00019842605)
                             * fVar106 + 0.008333348) * fVar106 + -0.16666667) * fVar106 + 1.0) *
                          fVar281,(((((fVar105 * -2.5029328e-08 + 2.7600126e-06) * fVar105 +
                                     -0.00019842605) * fVar105 + 0.008333348) * fVar105 +
                                   -0.16666667) * fVar105 + 1.0) * fVar267);
            auVar279._8_4_ =
                 (((((fVar119 * -2.5029328e-08 + 2.7600126e-06) * fVar119 + -0.00019842605) *
                    fVar119 + 0.008333348) * fVar119 + -0.16666667) * fVar119 + 1.0) * fVar283;
            auVar279._12_4_ =
                 (((((fVar79 * -2.5029328e-08 + 2.7600126e-06) * fVar79 + -0.00019842605) * fVar79 +
                   0.008333348) * fVar79 + -0.16666667) * fVar79 + 1.0) * fVar285;
            auVar192._0_4_ =
                 ((((fVar105 * -2.5963018e-07 + 2.4756235e-05) * fVar105 + -0.001388833) * fVar105 +
                  0.04166664) * fVar105 + -0.5) * fVar105 + 1.0;
            auVar192._4_4_ =
                 ((((fVar106 * -2.5963018e-07 + 2.4756235e-05) * fVar106 + -0.001388833) * fVar106 +
                  0.04166664) * fVar106 + -0.5) * fVar106 + 1.0;
            auVar192._8_4_ =
                 ((((fVar119 * -2.5963018e-07 + 2.4756235e-05) * fVar119 + -0.001388833) * fVar119 +
                  0.04166664) * fVar119 + -0.5) * fVar119 + 1.0;
            auVar192._12_4_ =
                 ((((fVar79 * -2.5963018e-07 + 2.4756235e-05) * fVar79 + -0.001388833) * fVar79 +
                  0.04166664) * fVar79 + -0.5) * fVar79 + 1.0;
            auVar294._8_4_ = auVar279._8_4_;
            auVar294._0_8_ = auVar279._0_8_;
            auVar294._12_4_ = auVar279._12_4_;
            auVar218 = blendvps(auVar294,auVar192,auVar226);
            auVar269 = blendvps(auVar279,auVar192,auVar137);
            auVar35._0_4_ = -(uint)(1 < uVar37);
            auVar35._4_4_ = -(uint)(1 < uVar42);
            auVar35._8_4_ = -(uint)(1 < uVar40);
            auVar35._12_4_ = -(uint)(1 < uVar44);
            auVar138._0_8_ = auVar218._0_8_ ^ 0x8000000080000000;
            auVar138._8_4_ = auVar218._8_4_ ^ 0x80000000;
            auVar138._12_4_ = auVar218._12_4_ ^ 0x80000000;
            auVar261 = blendvps(auVar218,auVar138,auVar35);
            uVar37 = uVar37 - 1;
            uVar42 = uVar42 - 1;
            uVar40 = uVar40 - 1;
            uVar44 = uVar44 - 1;
            auVar116._0_4_ = -(uint)(((uVar37 == 0) * uVar37 | (uint)(uVar37 != 0)) == uVar37);
            auVar116._4_4_ = -(uint)(((uVar42 == 0) * uVar42 | (uint)(uVar42 != 0)) == uVar42);
            auVar116._8_4_ = -(uint)(((uVar40 == 0) * uVar40 | (uint)(uVar40 != 0)) == uVar40);
            auVar116._12_4_ = -(uint)(((uVar44 == 0) * uVar44 | (uint)(uVar44 != 0)) == uVar44);
            auVar76._0_8_ = auVar269._0_8_ ^ 0x8000000080000000;
            auVar76._8_4_ = auVar269._8_4_ ^ 0x80000000;
            auVar76._12_4_ = auVar269._12_4_ ^ 0x80000000;
            auVar218 = blendvps(auVar269,auVar76,auVar116);
            fVar267 = (float)local_178._0_4_ * fVar186 - auVar323._0_4_;
            fVar281 = (float)local_178._4_4_ * fVar188 - auVar323._4_4_;
            fVar283 = fStack_170 * fVar194 - auVar323._8_4_;
            fVar285 = fStack_16c * fVar196 - auVar323._12_4_;
            fVar122 = (float)local_238._0_4_ * fVar186 - auVar326._0_4_;
            fVar123 = (float)local_238._4_4_ * fVar188 - auVar326._4_4_;
            fVar125 = fStack_230 * fVar194 - auVar326._8_4_;
            fVar126 = fStack_22c * fVar196 - auVar326._12_4_;
            local_218._0_4_ = auVar130._0_4_;
            local_218._4_4_ = auVar130._4_4_;
            fStack_210 = auVar130._8_4_;
            fStack_20c = auVar130._12_4_;
            fVar139 = (float)local_1f8._0_4_ * fVar186 - (float)local_218._0_4_;
            fVar140 = (float)local_1f8._4_4_ * fVar188 - (float)local_218._4_4_;
            fVar141 = fStack_1f0 * fVar194 - fStack_210;
            fVar142 = fStack_1ec * fVar196 - fStack_20c;
            local_288._0_4_ = auVar108._0_4_;
            local_288._4_4_ = auVar108._4_4_;
            fStack_280 = auVar108._8_4_;
            fStack_27c = auVar108._12_4_;
            fVar241 = (float)local_228._0_4_ * fVar186 - (float)local_288._0_4_;
            fVar242 = (float)local_228._4_4_ * fVar188 - (float)local_288._4_4_;
            fVar243 = fStack_220 * fVar194 - fStack_280;
            fVar244 = fStack_21c * fVar196 - fStack_27c;
            auVar77._0_4_ =
                 fVar241 * fVar241 + fVar139 * fVar139 + fVar122 * fVar122 + fVar267 * fVar267;
            auVar77._4_4_ =
                 fVar242 * fVar242 + fVar140 * fVar140 + fVar123 * fVar123 + fVar281 * fVar281;
            auVar77._8_4_ =
                 fVar243 * fVar243 + fVar141 * fVar141 + fVar125 * fVar125 + fVar283 * fVar283;
            auVar77._12_4_ =
                 fVar244 * fVar244 + fVar142 * fVar142 + fVar126 * fVar126 + fVar285 * fVar285;
            auVar269 = rsqrtps(auVar192,auVar77);
            fVar105 = auVar269._0_4_;
            fVar106 = auVar269._4_4_;
            fVar119 = auVar269._8_4_;
            fVar79 = auVar269._12_4_;
            fVar143 = fVar105 * 1.5 - fVar105 * fVar105 * auVar77._0_4_ * 0.5 * fVar105;
            fVar144 = fVar106 * 1.5 - fVar106 * fVar106 * auVar77._4_4_ * 0.5 * fVar106;
            fVar145 = fVar119 * 1.5 - fVar119 * fVar119 * auVar77._8_4_ * 0.5 * fVar119;
            fVar185 = fVar79 * 1.5 - fVar79 * fVar79 * auVar77._12_4_ * 0.5 * fVar79;
            fVar214 = auVar261._0_4_;
            fVar227 = auVar261._4_4_;
            fVar228 = auVar261._8_4_;
            fVar238 = auVar261._12_4_;
            fVar198 = auVar218._0_4_;
            fVar199 = auVar218._4_4_;
            fVar212 = auVar218._8_4_;
            fVar213 = auVar218._12_4_;
            local_2b8._4_4_ = (float)local_178._4_4_ * fVar199 - fVar281 * fVar144 * fVar227;
            local_2b8._0_4_ = (float)local_178._0_4_ * fVar198 - fVar267 * fVar143 * fVar214;
            uStack_2b0._0_4_ = fStack_170 * fVar212 - fVar283 * fVar145 * fVar228;
            uStack_2b0._4_4_ = fStack_16c * fVar213 - fVar285 * fVar185 * fVar238;
            fVar239 = (auVar323._0_4_ - (float)local_178._0_4_) * auVar305._0_4_ +
                      (float)local_178._0_4_;
            fVar240 = (auVar323._4_4_ - (float)local_178._4_4_) * auVar305._4_4_ +
                      (float)local_178._4_4_;
            fStack_170 = (auVar323._8_4_ - fStack_170) * auVar305._8_4_ + fStack_170;
            fStack_16c = (auVar323._12_4_ - fStack_16c) * auVar305._12_4_ + fStack_16c;
            fVar189 = (auVar326._0_4_ - (float)local_238._0_4_) * auVar305._0_4_ +
                      (float)local_238._0_4_;
            fVar253 = (auVar326._4_4_ - (float)local_238._4_4_) * auVar305._4_4_ +
                      (float)local_238._4_4_;
            fVar187 = (auVar326._8_4_ - fStack_230) * auVar305._8_4_ + fStack_230;
            fVar195 = (auVar326._12_4_ - fStack_22c) * auVar305._12_4_ + fStack_22c;
            fVar267 = ((float)local_218._0_4_ - (float)local_1f8._0_4_) * auVar305._0_4_ +
                      (float)local_1f8._0_4_;
            fVar281 = ((float)local_218._4_4_ - (float)local_1f8._4_4_) * auVar305._4_4_ +
                      (float)local_1f8._4_4_;
            fVar283 = (fStack_210 - fStack_1f0) * auVar305._8_4_ + fStack_1f0;
            fVar285 = (fStack_20c - fStack_1ec) * auVar305._12_4_ + fStack_1ec;
            auVar117._0_4_ = fVar267 * fVar267 + fVar189 * fVar189 + fVar239 * fVar239;
            auVar117._4_4_ = fVar281 * fVar281 + fVar253 * fVar253 + fVar240 * fVar240;
            auVar117._8_4_ = fVar283 * fVar283 + fVar187 * fVar187 + fStack_170 * fStack_170;
            auVar117._12_4_ = fVar285 * fVar285 + fVar195 * fVar195 + fStack_16c * fStack_16c;
            fVar105 = ((float)local_288._0_4_ - (float)local_228._0_4_) * auVar305._0_4_ +
                      (float)local_228._0_4_;
            fVar106 = ((float)local_288._4_4_ - (float)local_228._4_4_) * auVar305._4_4_ +
                      (float)local_228._4_4_;
            fVar119 = (fStack_280 - fStack_220) * auVar305._8_4_ + fStack_220;
            fVar79 = (fStack_27c - fStack_21c) * auVar305._12_4_ + fStack_21c;
            auVar78._0_4_ = fVar105 * fVar105 + auVar117._0_4_;
            auVar78._4_4_ = fVar106 * fVar106 + auVar117._4_4_;
            auVar78._8_4_ = fVar119 * fVar119 + auVar117._8_4_;
            auVar78._12_4_ = fVar79 * fVar79 + auVar117._12_4_;
            auVar269 = rsqrtps(auVar117,auVar78);
            fVar197 = auVar269._0_4_;
            fVar120 = auVar269._4_4_;
            fVar124 = auVar269._8_4_;
            fVar121 = auVar269._12_4_;
            fVar197 = fVar197 * 1.5 - fVar197 * fVar197 * auVar78._0_4_ * 0.5 * fVar197;
            fVar120 = fVar120 * 1.5 - fVar120 * fVar120 * auVar78._4_4_ * 0.5 * fVar120;
            fVar124 = fVar124 * 1.5 - fVar124 * fVar124 * auVar78._8_4_ * 0.5 * fVar124;
            fVar121 = fVar121 * 1.5 - fVar121 * fVar121 * auVar78._12_4_ * 0.5 * fVar121;
            auVar309._0_4_ = fVar239 * fVar197;
            auVar309._4_4_ = fVar240 * fVar120;
            auVar309._8_4_ = fStack_170 * fVar124;
            auVar309._12_4_ = fStack_16c * fVar121;
            auVar36._4_4_ = -(uint)(0.9995 < fVar188);
            auVar36._0_4_ = -(uint)(0.9995 < fVar186);
            auVar36._8_4_ = -(uint)(0.9995 < fVar194);
            auVar36._12_4_ = -(uint)(0.9995 < fVar196);
            auVar269 = blendvps(_local_2b8,auVar309,auVar36);
            auVar118._0_4_ = (float)local_238._0_4_ * fVar198 - fVar122 * fVar143 * fVar214;
            auVar118._4_4_ = (float)local_238._4_4_ * fVar199 - fVar123 * fVar144 * fVar227;
            auVar118._8_4_ = fStack_230 * fVar212 - fVar125 * fVar145 * fVar228;
            auVar118._12_4_ = fStack_22c * fVar213 - fVar126 * fVar185 * fVar238;
            auVar101._0_4_ = fVar189 * fVar197;
            auVar101._4_4_ = fVar253 * fVar120;
            auVar101._8_4_ = fVar187 * fVar124;
            auVar101._12_4_ = fVar195 * fVar121;
            auVar108 = blendvps(auVar118,auVar101,auVar36);
            auVar193._0_4_ = (float)local_1f8._0_4_ * fVar198 - fVar139 * fVar143 * fVar214;
            auVar193._4_4_ = (float)local_1f8._4_4_ * fVar199 - fVar140 * fVar144 * fVar227;
            auVar193._8_4_ = fStack_1f0 * fVar212 - fVar141 * fVar145 * fVar228;
            auVar193._12_4_ = fStack_1ec * fVar213 - fVar142 * fVar185 * fVar238;
            auVar211._0_4_ = fVar267 * fVar197;
            auVar211._4_4_ = fVar281 * fVar120;
            auVar211._8_4_ = fVar283 * fVar124;
            auVar211._12_4_ = fVar285 * fVar121;
            auVar130 = blendvps(auVar193,auVar211,auVar36);
            auVar280._0_4_ = fVar198 * (float)local_228._0_4_ - fVar143 * fVar241 * fVar214;
            auVar280._4_4_ = fVar199 * (float)local_228._4_4_ - fVar144 * fVar242 * fVar227;
            auVar280._8_4_ = fVar212 * fStack_220 - fVar145 * fVar243 * fVar228;
            auVar280._12_4_ = fVar213 * fStack_21c - fVar185 * fVar244 * fVar238;
            auVar237._0_4_ = fVar197 * fVar105;
            auVar237._4_4_ = fVar120 * fVar106;
            auVar237._8_4_ = fVar124 * fVar119;
            auVar237._12_4_ = fVar121 * fVar79;
            auVar218 = blendvps(auVar280,auVar237,auVar36);
            fVar267 = 1.0 - auVar305._0_4_;
            fVar281 = 1.0 - auVar305._4_4_;
            fVar283 = 1.0 - auVar305._8_4_;
            fVar285 = 1.0 - auVar305._12_4_;
            local_298._4_4_ =
                 (float)local_298._4_4_ * fVar281 + (float)local_c8._4_4_ * auVar305._4_4_;
            local_298._0_4_ =
                 (float)local_298._0_4_ * fVar267 + (float)local_c8._0_4_ * auVar305._0_4_;
            fStack_290 = fStack_290 * fVar283 + fStack_c0 * auVar305._8_4_;
            fStack_28c = fStack_28c * fVar285 + fStack_bc * auVar305._12_4_;
            local_268._4_4_ =
                 (float)local_268._4_4_ * fVar281 + (float)local_b8._4_4_ * auVar305._4_4_;
            local_268._0_4_ =
                 (float)local_268._0_4_ * fVar267 + (float)local_b8._0_4_ * auVar305._0_4_;
            uStack_260._0_4_ = (float)uStack_260 * fVar283 + fStack_b0 * auVar305._8_4_;
            uStack_260._4_4_ = uStack_260._4_4_ * fVar285 + fStack_ac * auVar305._12_4_;
            local_258._4_4_ =
                 (float)local_258._4_4_ * fVar281 + (float)local_a8._4_4_ * auVar305._4_4_;
            local_258._0_4_ =
                 (float)local_258._0_4_ * fVar267 + (float)local_a8._0_4_ * auVar305._0_4_;
            uStack_250._0_4_ = (float)uStack_250 * fVar283 + fStack_a0 * auVar305._8_4_;
            uStack_250._4_4_ = uStack_250._4_4_ * fVar285 + fStack_9c * auVar305._12_4_;
            local_248._4_4_ =
                 (float)local_248._4_4_ * fVar281 + (float)local_98._4_4_ * auVar305._4_4_;
            local_248._0_4_ =
                 (float)local_248._0_4_ * fVar267 + (float)local_98._0_4_ * auVar305._0_4_;
            uStack_240._0_4_ = (float)uStack_240 * fVar283 + fStack_90 * auVar305._8_4_;
            uStack_240._4_4_ = uStack_240._4_4_ * fVar285 + fStack_8c * auVar305._12_4_;
            local_1e8._4_4_ =
                 (float)local_1e8._4_4_ * fVar281 + (float)local_88._4_4_ * auVar305._4_4_;
            local_1e8._0_4_ =
                 (float)local_1e8._0_4_ * fVar267 + (float)local_88._0_4_ * auVar305._0_4_;
            fStack_1e0 = fStack_1e0 * fVar283 + fStack_80 * auVar305._8_4_;
            fStack_1dc = fStack_1dc * fVar285 + fStack_7c * auVar305._12_4_;
            local_278._4_4_ =
                 (float)local_278._4_4_ * fVar281 + (float)local_118._4_4_ * auVar305._4_4_;
            local_278._0_4_ =
                 (float)local_278._0_4_ * fVar267 + (float)local_118._0_4_ * auVar305._0_4_;
            uStack_270._0_4_ = (float)uStack_270 * fVar283 + fStack_110 * auVar305._8_4_;
            uStack_270._4_4_ = uStack_270._4_4_ * fVar285 + fStack_10c * auVar305._12_4_;
            local_2a8._4_4_ =
                 (float)local_2a8._4_4_ * fVar281 + (float)local_108._4_4_ * auVar305._4_4_;
            local_2a8._0_4_ =
                 (float)local_2a8._0_4_ * fVar267 + (float)local_108._0_4_ * auVar305._0_4_;
            fStack_2a0 = fStack_2a0 * fVar283 + fStack_100 * auVar305._8_4_;
            fStack_29c = fStack_29c * fVar285 + fStack_fc * auVar305._12_4_;
            local_1c8._4_4_ =
                 (float)local_1c8._4_4_ * fVar281 + (float)local_188._4_4_ * auVar305._4_4_;
            local_1c8._0_4_ =
                 (float)local_1c8._0_4_ * fVar267 + (float)local_188._0_4_ * auVar305._0_4_;
            fStack_1c0 = fStack_1c0 * fVar283 + fStack_180 * auVar305._8_4_;
            fStack_1bc = fStack_1bc * fVar285 + fStack_17c * auVar305._12_4_;
            local_1d8._4_4_ =
                 (float)local_1d8._4_4_ * fVar281 + (float)local_f8._4_4_ * auVar305._4_4_;
            local_1d8._0_4_ =
                 (float)local_1d8._0_4_ * fVar267 + (float)local_f8._0_4_ * auVar305._0_4_;
            fStack_1d0 = fStack_1d0 * fVar283 + fStack_f0 * auVar305._8_4_;
            fStack_1cc = fStack_1cc * fVar285 + fStack_ec * auVar305._12_4_;
            local_208._4_4_ =
                 (float)local_208._4_4_ * fVar281 + (float)local_168._4_4_ * auVar305._4_4_;
            local_208._0_4_ =
                 (float)local_208._0_4_ * fVar267 + (float)local_168._0_4_ * auVar305._0_4_;
            uStack_200._0_4_ = (float)uStack_200 * fVar283 + fStack_160 * auVar305._8_4_;
            uStack_200._4_4_ = uStack_200._4_4_ * fVar285 + fStack_15c * auVar305._12_4_;
            local_1b8._4_4_ =
                 (float)local_1b8._4_4_ * fVar281 + (float)local_158._4_4_ * auVar305._4_4_;
            local_1b8._0_4_ =
                 (float)local_1b8._0_4_ * fVar267 + (float)local_158._0_4_ * auVar305._0_4_;
            fStack_1b0 = fStack_1b0 * fVar283 + fStack_150 * auVar305._8_4_;
            fStack_1ac = fStack_1ac * fVar285 + fStack_14c * auVar305._12_4_;
            local_218._4_4_ =
                 fVar281 * (float)local_198._4_4_ + (float)local_148._4_4_ * auVar305._4_4_;
            local_218._0_4_ =
                 fVar267 * (float)local_198._0_4_ + (float)local_148._0_4_ * auVar305._0_4_;
            fStack_210 = fVar283 * fStack_190 + fStack_140 * auVar305._8_4_;
            fStack_20c = fVar285 * fStack_18c + fStack_13c * auVar305._12_4_;
            fVar197 = auVar108._0_4_;
            fVar120 = auVar108._4_4_;
            fVar121 = auVar108._12_4_;
            local_2b8._0_4_ = auVar269._0_4_;
            local_2b8._4_4_ = auVar269._4_4_;
            uStack_2b0._0_4_ = auVar269._8_4_;
            uStack_2b0._4_4_ = auVar269._12_4_;
            fVar124 = auVar108._8_4_;
            fVar140 = auVar130._0_4_;
            fVar142 = auVar130._4_4_;
            fVar144 = auVar130._8_4_;
            fVar185 = auVar130._12_4_;
            fVar105 = auVar218._0_4_;
            fVar119 = auVar218._4_4_;
            fVar189 = auVar218._8_4_;
            fVar187 = auVar218._12_4_;
            fVar267 = fVar197 * fVar140 + (float)local_2b8._0_4_ * fVar105;
            fVar281 = fVar120 * fVar142 + (float)local_2b8._4_4_ * fVar119;
            fVar283 = fVar124 * fVar144 + (float)uStack_2b0 * fVar189;
            fVar285 = fVar121 * fVar185 + uStack_2b0._4_4_ * fVar187;
            fVar239 = fVar197 * fVar140 - (float)local_2b8._0_4_ * fVar105;
            fVar240 = fVar120 * fVar142 - (float)local_2b8._4_4_ * fVar119;
            fVar241 = fVar124 * fVar144 - (float)uStack_2b0 * fVar189;
            fVar242 = fVar121 * fVar185 - uStack_2b0._4_4_ * fVar187;
            fVar198 = fVar140 * fVar140;
            fVar199 = fVar142 * fVar142;
            fVar212 = fVar144 * fVar144;
            fVar213 = fVar185 * fVar185;
            fVar106 = (float)local_2b8._0_4_ * (float)local_2b8._0_4_ - fVar197 * fVar197;
            fVar79 = (float)local_2b8._4_4_ * (float)local_2b8._4_4_ - fVar120 * fVar120;
            fVar253 = (float)uStack_2b0 * (float)uStack_2b0 - fVar124 * fVar124;
            fVar195 = uStack_2b0._4_4_ * uStack_2b0._4_4_ - fVar121 * fVar121;
            fVar139 = fVar197 * fVar105 - (float)local_2b8._0_4_ * fVar140;
            fVar141 = fVar120 * fVar119 - (float)local_2b8._4_4_ * fVar142;
            fVar143 = fVar124 * fVar189 - (float)uStack_2b0 * fVar144;
            fVar145 = fVar121 * fVar187 - uStack_2b0._4_4_ * fVar185;
            fVar122 = (float)local_2b8._0_4_ * fVar140 + fVar197 * fVar105;
            fVar123 = (float)local_2b8._4_4_ * fVar142 + fVar120 * fVar119;
            fVar125 = (float)uStack_2b0 * fVar144 + fVar124 * fVar189;
            fVar126 = uStack_2b0._4_4_ * fVar185 + fVar121 * fVar187;
            fVar186 = fVar105 * fVar140 + fVar197 * (float)local_2b8._0_4_;
            fVar188 = fVar119 * fVar142 + fVar120 * (float)local_2b8._4_4_;
            fVar194 = fVar189 * fVar144 + fVar124 * (float)uStack_2b0;
            fVar196 = fVar187 * fVar185 + fVar121 * uStack_2b0._4_4_;
            fVar140 = fVar105 * fVar140 - fVar197 * (float)local_2b8._0_4_;
            fVar142 = fVar119 * fVar142 - fVar120 * (float)local_2b8._4_4_;
            fVar144 = fVar189 * fVar144 - fVar124 * (float)uStack_2b0;
            fVar185 = fVar187 * fVar185 - fVar121 * uStack_2b0._4_4_;
            fVar105 = fVar105 * fVar105;
            fVar119 = fVar119 * fVar119;
            fVar189 = fVar189 * fVar189;
            fVar187 = fVar187 * fVar187;
            fVar214 = (((float)local_2b8._0_4_ * (float)local_2b8._0_4_ + fVar197 * fVar197) -
                      fVar198) - fVar105;
            fVar227 = (((float)local_2b8._4_4_ * (float)local_2b8._4_4_ + fVar120 * fVar120) -
                      fVar199) - fVar119;
            fVar228 = (((float)uStack_2b0 * (float)uStack_2b0 + fVar124 * fVar124) - fVar212) -
                      fVar189;
            fVar238 = ((uStack_2b0._4_4_ * uStack_2b0._4_4_ + fVar121 * fVar121) - fVar213) -
                      fVar187;
            fVar197 = (fVar198 + fVar106) - fVar105;
            fVar120 = (fVar199 + fVar79) - fVar119;
            fVar124 = (fVar212 + fVar253) - fVar189;
            fVar121 = (fVar213 + fVar195) - fVar187;
            fVar105 = (fVar106 - fVar198) + fVar105;
            fVar119 = (fVar79 - fVar199) + fVar119;
            fVar189 = (fVar253 - fVar212) + fVar189;
            fVar187 = (fVar195 - fVar213) + fVar187;
          }
          fVar106 = (fVar139 + fVar139) * 0.0;
          fVar79 = (fVar141 + fVar141) * 0.0;
          fVar253 = (fVar143 + fVar143) * 0.0;
          fVar195 = (fVar145 + fVar145) * 0.0;
          fVar243 = (fVar267 + fVar267) * 0.0;
          fVar252 = (fVar281 + fVar281) * 0.0;
          fVar255 = (fVar283 + fVar283) * 0.0;
          fVar286 = (fVar285 + fVar285) * 0.0;
          fVar244 = fVar243 + fVar106 + fVar214;
          fVar254 = fVar252 + fVar79 + fVar227;
          fVar312 = fVar255 + fVar253 + fVar228;
          fVar295 = fVar286 + fVar195 + fVar238;
          fVar198 = fVar106 + fVar267 + fVar267 + fVar214 * 0.0;
          fVar199 = fVar79 + fVar281 + fVar281 + fVar227 * 0.0;
          fVar212 = fVar253 + fVar283 + fVar283 + fVar228 * 0.0;
          fVar213 = fVar195 + fVar285 + fVar285 + fVar238 * 0.0;
          fVar303 = fVar214 * 0.0 + fVar139 + fVar139 + fVar243;
          fVar313 = fVar227 * 0.0 + fVar141 + fVar141 + fVar252;
          fVar316 = fVar228 * 0.0 + fVar143 + fVar143 + fVar255;
          fVar319 = fVar238 * 0.0 + fVar145 + fVar145 + fVar286;
          fVar267 = (fVar186 + fVar186) * 0.0;
          fVar281 = (fVar188 + fVar188) * 0.0;
          fVar283 = (fVar194 + fVar194) * 0.0;
          fVar285 = (fVar196 + fVar196) * 0.0;
          fVar243 = fVar267 + fVar197 * 0.0 + fVar239 + fVar239;
          fVar252 = fVar281 + fVar120 * 0.0 + fVar240 + fVar240;
          fVar255 = fVar283 + fVar124 * 0.0 + fVar241 + fVar241;
          fVar286 = fVar285 + fVar121 * 0.0 + fVar242 + fVar242;
          fVar321 = (fVar239 + fVar239) * 0.0;
          fVar328 = (fVar240 + fVar240) * 0.0;
          fVar330 = (fVar241 + fVar241) * 0.0;
          fVar332 = (fVar242 + fVar242) * 0.0;
          fVar287 = fVar197 + fVar267 + fVar321;
          fVar327 = fVar120 + fVar281 + fVar328;
          fVar331 = fVar124 + fVar283 + fVar330;
          fVar299 = fVar121 + fVar285 + fVar332;
          fVar321 = fVar321 + fVar197 * 0.0 + fVar186 + fVar186;
          fVar328 = fVar328 + fVar120 * 0.0 + fVar188 + fVar188;
          fVar330 = fVar330 + fVar124 * 0.0 + fVar194 + fVar194;
          fVar332 = fVar332 + fVar121 * 0.0 + fVar196 + fVar196;
          fVar267 = (fVar140 + fVar140) * 0.0;
          fVar281 = (fVar142 + fVar142) * 0.0;
          fVar283 = (fVar144 + fVar144) * 0.0;
          fVar285 = (fVar185 + fVar185) * 0.0;
          fVar197 = fVar267 + fVar105 * 0.0 + fVar122 + fVar122;
          fVar124 = fVar281 + fVar119 * 0.0 + fVar123 + fVar123;
          fVar186 = fVar283 + fVar189 * 0.0 + fVar125 + fVar125;
          fVar194 = fVar285 + fVar187 * 0.0 + fVar126 + fVar126;
          fVar120 = (fVar122 + fVar122) * 0.0;
          fVar121 = (fVar123 + fVar123) * 0.0;
          fVar123 = (fVar125 + fVar125) * 0.0;
          fVar126 = (fVar126 + fVar126) * 0.0;
          fVar122 = fVar105 * 0.0 + fVar140 + fVar140 + fVar120;
          fVar125 = fVar119 * 0.0 + fVar142 + fVar142 + fVar121;
          fVar239 = fVar189 * 0.0 + fVar144 + fVar144 + fVar123;
          fVar240 = fVar187 * 0.0 + fVar185 + fVar185 + fVar126;
          fVar120 = fVar120 + fVar267 + fVar105;
          fVar121 = fVar121 + fVar281 + fVar119;
          fVar123 = fVar123 + fVar283 + fVar189;
          fVar126 = fVar126 + fVar285 + fVar187;
          fVar214 = (float)local_298._0_4_ * fVar244 + fVar243 * 0.0 + fVar197 * 0.0;
          fVar227 = (float)local_298._4_4_ * fVar254 + fVar252 * 0.0 + fVar124 * 0.0;
          fVar228 = fStack_290 * fVar312 + fVar255 * 0.0 + fVar186 * 0.0;
          fVar238 = fStack_28c * fVar295 + fVar286 * 0.0 + fVar194 * 0.0;
          fVar241 = (float)local_298._0_4_ * fVar198 + fVar287 * 0.0 + fVar122 * 0.0;
          fVar242 = (float)local_298._4_4_ * fVar199 + fVar327 * 0.0 + fVar125 * 0.0;
          fVar296 = fStack_290 * fVar212 + fVar331 * 0.0 + fVar239 * 0.0;
          fVar298 = fStack_28c * fVar213 + fVar299 * 0.0 + fVar240 * 0.0;
          fVar143 = (float)local_298._0_4_ * fVar303 + fVar321 * 0.0 + fVar120 * 0.0;
          fVar145 = (float)local_298._4_4_ * fVar313 + fVar328 * 0.0 + fVar121 * 0.0;
          fVar188 = fStack_290 * fVar316 + fVar330 * 0.0 + fVar123 * 0.0;
          fVar196 = fStack_28c * fVar319 + fVar332 * 0.0 + fVar126 * 0.0;
          fVar302 = (float)local_248._0_4_ * fVar244 +
                    (float)local_1e8._0_4_ * fVar243 + fVar197 * 0.0;
          fVar311 = (float)local_248._4_4_ * fVar254 +
                    (float)local_1e8._4_4_ * fVar252 + fVar124 * 0.0;
          fVar315 = (float)uStack_240 * fVar312 + fStack_1e0 * fVar255 + fVar186 * 0.0;
          fVar318 = uStack_240._4_4_ * fVar295 + fStack_1dc * fVar286 + fVar194 * 0.0;
          fVar189 = (float)local_248._0_4_ * fVar198 +
                    (float)local_1e8._0_4_ * fVar287 + fVar122 * 0.0;
          fVar253 = (float)local_248._4_4_ * fVar199 +
                    (float)local_1e8._4_4_ * fVar327 + fVar125 * 0.0;
          fVar187 = (float)uStack_240 * fVar212 + fStack_1e0 * fVar331 + fVar239 * 0.0;
          fVar195 = uStack_240._4_4_ * fVar213 + fStack_1dc * fVar299 + fVar240 * 0.0;
          fVar267 = (float)local_248._0_4_ * fVar303 +
                    (float)local_1e8._0_4_ * fVar321 + fVar120 * 0.0;
          fVar283 = (float)local_248._4_4_ * fVar313 +
                    (float)local_1e8._4_4_ * fVar328 + fVar121 * 0.0;
          fVar105 = (float)uStack_240 * fVar316 + fStack_1e0 * fVar330 + fVar123 * 0.0;
          fVar119 = uStack_240._4_4_ * fVar319 + fStack_1dc * fVar332 + fVar126 * 0.0;
          fVar139 = (float)local_2a8._0_4_ * fVar244 +
                    (float)local_1c8._0_4_ * fVar243 + (float)local_1d8._0_4_ * fVar197;
          fVar140 = (float)local_2a8._4_4_ * fVar254 +
                    (float)local_1c8._4_4_ * fVar252 + (float)local_1d8._4_4_ * fVar124;
          fVar141 = fStack_2a0 * fVar312 + fStack_1c0 * fVar255 + fStack_1d0 * fVar186;
          fVar142 = fStack_29c * fVar295 + fStack_1bc * fVar286 + fStack_1cc * fVar194;
          fVar320 = (float)local_2a8._0_4_ * fVar198 +
                    (float)local_1c8._0_4_ * fVar287 + (float)local_1d8._0_4_ * fVar122;
          fVar329 = (float)local_2a8._4_4_ * fVar199 +
                    (float)local_1c8._4_4_ * fVar327 + (float)local_1d8._4_4_ * fVar125;
          fVar297 = fStack_2a0 * fVar212 + fStack_1c0 * fVar331 + fStack_1d0 * fVar239;
          fVar300 = fStack_29c * fVar213 + fStack_1bc * fVar299 + fStack_1cc * fVar240;
          fVar281 = (float)local_2a8._0_4_ * fVar303 +
                    (float)local_1c8._0_4_ * fVar321 + (float)local_1d8._0_4_ * fVar120;
          fVar285 = (float)local_2a8._4_4_ * fVar313 +
                    (float)local_1c8._4_4_ * fVar328 + (float)local_1d8._4_4_ * fVar121;
          fVar106 = fStack_2a0 * fVar316 + fStack_1c0 * fVar330 + fStack_1d0 * fVar123;
          fVar79 = fStack_29c * fVar319 + fStack_1bc * fVar332 + fStack_1cc * fVar126;
          fVar144 = fVar244 * (float)local_208._0_4_ +
                    fVar243 * (float)local_1b8._0_4_ + fVar197 * (float)local_218._0_4_ +
                    (float)local_268._0_4_ + 0.0;
          fVar185 = fVar254 * (float)local_208._4_4_ +
                    fVar252 * (float)local_1b8._4_4_ + fVar124 * (float)local_218._4_4_ +
                    (float)local_268._4_4_ + 0.0;
          fVar186 = fVar312 * (float)uStack_200 + fVar255 * fStack_1b0 + fVar186 * fStack_210 +
                    (float)uStack_260 + 0.0;
          fVar194 = fVar295 * uStack_200._4_4_ + fVar286 * fStack_1ac + fVar194 * fStack_20c +
                    uStack_260._4_4_ + 0.0;
          fVar197 = fVar198 * (float)local_208._0_4_ +
                    fVar287 * (float)local_1b8._0_4_ + fVar122 * (float)local_218._0_4_ +
                    (float)local_258._0_4_ + 0.0;
          fVar124 = fVar199 * (float)local_208._4_4_ +
                    fVar327 * (float)local_1b8._4_4_ + fVar125 * (float)local_218._4_4_ +
                    (float)local_258._4_4_ + 0.0;
          fVar122 = fVar212 * (float)uStack_200 + fVar331 * fStack_1b0 + fVar239 * fStack_210 +
                    (float)uStack_250 + 0.0;
          fVar125 = fVar213 * uStack_200._4_4_ + fVar299 * fStack_1ac + fVar240 * fStack_20c +
                    uStack_250._4_4_ + 0.0;
          fVar120 = fVar303 * (float)local_208._0_4_ +
                    fVar321 * (float)local_1b8._0_4_ + fVar120 * (float)local_218._0_4_ +
                    (float)local_278._0_4_ + 0.0;
          fVar121 = fVar313 * (float)local_208._4_4_ +
                    fVar328 * (float)local_1b8._4_4_ + fVar121 * (float)local_218._4_4_ +
                    (float)local_278._4_4_ + 0.0;
          fVar123 = fVar316 * (float)uStack_200 + fVar330 * fStack_1b0 + fVar123 * fStack_210 +
                    (float)uStack_270 + 0.0;
          fVar126 = fVar319 * uStack_200._4_4_ + fVar332 * fStack_1ac + fVar126 * fStack_20c +
                    uStack_270._4_4_ + 0.0;
          auVar136._0_4_ = fVar189 * fVar281 - fVar267 * fVar320;
          auVar136._4_4_ = fVar253 * fVar285 - fVar283 * fVar329;
          auVar136._8_4_ = fVar187 * fVar106 - fVar105 * fVar297;
          auVar136._12_4_ = fVar195 * fVar79 - fVar119 * fVar300;
          auVar224._0_4_ = fVar267 * fVar139 - fVar302 * fVar281;
          auVar224._4_4_ = fVar283 * fVar140 - fVar311 * fVar285;
          auVar224._8_4_ = fVar105 * fVar141 - fVar315 * fVar106;
          auVar224._12_4_ = fVar119 * fVar142 - fVar318 * fVar79;
          auVar251._0_4_ = fVar302 * fVar320 - fVar189 * fVar139;
          auVar251._4_4_ = fVar311 * fVar329 - fVar253 * fVar140;
          auVar251._8_4_ = fVar315 * fVar297 - fVar187 * fVar141;
          auVar251._12_4_ = fVar318 * fVar300 - fVar195 * fVar142;
          auVar235._0_4_ = fVar320 * fVar143 - fVar281 * fVar241;
          auVar235._4_4_ = fVar329 * fVar145 - fVar285 * fVar242;
          auVar235._8_4_ = fVar297 * fVar188 - fVar106 * fVar296;
          auVar235._12_4_ = fVar300 * fVar196 - fVar79 * fVar298;
          auVar28._0_4_ = fVar281 * fVar214 - fVar139 * fVar143;
          auVar28._4_4_ = fVar285 * fVar227 - fVar140 * fVar145;
          auVar28._8_4_ = fVar106 * fVar228 - fVar141 * fVar188;
          auVar28._12_4_ = fVar79 * fVar238 - fVar142 * fVar196;
          auVar152._0_4_ = fVar139 * fVar241 - fVar320 * fVar214;
          auVar152._4_4_ = fVar140 * fVar242 - fVar329 * fVar227;
          auVar152._8_4_ = fVar141 * fVar296 - fVar297 * fVar228;
          auVar152._12_4_ = fVar142 * fVar298 - fVar300 * fVar238;
          auVar308._0_4_ = fVar241 * fVar267 - fVar143 * fVar189;
          auVar308._4_4_ = fVar242 * fVar283 - fVar145 * fVar253;
          auVar308._8_4_ = fVar296 * fVar105 - fVar188 * fVar187;
          auVar308._12_4_ = fVar298 * fVar119 - fVar196 * fVar195;
          auVar325._0_4_ = fVar143 * fVar302 - fVar267 * fVar214;
          auVar325._4_4_ = fVar145 * fVar311 - fVar283 * fVar227;
          auVar325._8_4_ = fVar188 * fVar315 - fVar105 * fVar228;
          auVar325._12_4_ = fVar196 * fVar318 - fVar119 * fVar238;
          auVar291._4_4_ = fVar253 * fVar227 - fVar311 * fVar242;
          auVar291._0_4_ = fVar189 * fVar214 - fVar302 * fVar241;
          auVar291._8_4_ = fVar187 * fVar228 - fVar315 * fVar296;
          auVar291._12_4_ = fVar195 * fVar238 - fVar318 * fVar298;
          auVar210._0_4_ =
               fVar214 * auVar136._0_4_ + fVar241 * auVar224._0_4_ + fVar143 * auVar251._0_4_;
          auVar210._4_4_ =
               fVar227 * auVar136._4_4_ + fVar242 * auVar224._4_4_ + fVar145 * auVar251._4_4_;
          auVar210._8_4_ =
               fVar228 * auVar136._8_4_ + fVar296 * auVar224._8_4_ + fVar188 * auVar251._8_4_;
          auVar210._12_4_ =
               fVar238 * auVar136._12_4_ + fVar298 * auVar224._12_4_ + fVar196 * auVar251._12_4_;
          auVar130 = divps(auVar136,auVar210);
          auVar261 = divps(auVar235,auVar210);
          auVar305 = divps(auVar308,auVar210);
          auVar218 = divps(auVar224,auVar210);
          _local_2a8 = divps(auVar28,auVar210);
          auVar323 = divps(auVar325,auVar210);
          auVar269 = divps(auVar251,auVar210);
          _local_298 = divps(auVar152,auVar210);
          auVar108 = divps(auVar291,auVar210);
          fVar267 = fVar144 * auVar130._0_4_ + fVar197 * auVar218._0_4_ + fVar120 * auVar269._0_4_;
          fVar281 = fVar185 * auVar130._4_4_ + fVar124 * auVar218._4_4_ + fVar121 * auVar269._4_4_;
          fVar283 = fVar186 * auVar130._8_4_ + fVar122 * auVar218._8_4_ + fVar123 * auVar269._8_4_;
          fVar285 = fVar194 * auVar130._12_4_ +
                    fVar125 * auVar218._12_4_ + fVar126 * auVar269._12_4_;
          fVar105 = fVar144 * auVar261._0_4_ + fVar197 * local_2a8._0_4_ + fVar120 * local_298._0_4_
          ;
          fVar106 = fVar185 * auVar261._4_4_ + fVar124 * local_2a8._4_4_ + fVar121 * local_298._4_4_
          ;
          fVar119 = fVar186 * auVar261._8_4_ + fVar122 * local_2a8._8_4_ + fVar123 * local_298._8_4_
          ;
          fVar79 = fVar194 * auVar261._12_4_ +
                   fVar125 * local_2a8._12_4_ + fVar126 * local_298._12_4_;
          fVar189 = fVar144 * auVar305._0_4_ + fVar197 * auVar323._0_4_ + fVar120 * auVar108._0_4_;
          fVar253 = fVar185 * auVar305._4_4_ + fVar124 * auVar323._4_4_ + fVar121 * auVar108._4_4_;
          fVar187 = fVar186 * auVar305._8_4_ + fVar122 * auVar323._8_4_ + fVar123 * auVar108._8_4_;
          fVar195 = fVar194 * auVar305._12_4_ +
                    fVar125 * auVar323._12_4_ + fVar126 * auVar108._12_4_;
        }
        else {
          fVar267 = (this_00->super_Geometry).fnumTimeSegments;
          fVar281 = (this_00->super_Geometry).time_range.lower;
          auVar81._0_4_ = (this_00->super_Geometry).time_range.upper - fVar281;
          auVar46._4_4_ = fVar281;
          auVar46._0_4_ = fVar281;
          auVar46._8_4_ = fVar281;
          auVar46._12_4_ = fVar281;
          auVar110._4_4_ = fVar267;
          auVar110._0_4_ = fVar267;
          auVar110._8_4_ = fVar267;
          auVar110._12_4_ = fVar267;
          auVar268._0_4_ = *(float *)(ray + 0x70) - fVar281;
          auVar268._4_4_ = *(float *)(ray + 0x74) - fVar281;
          auVar268._8_4_ = *(float *)(ray + 0x78) - fVar281;
          auVar268._12_4_ = *(float *)(ray + 0x7c) - fVar281;
          auVar81._4_4_ = auVar81._0_4_;
          auVar81._8_4_ = auVar81._0_4_;
          auVar81._12_4_ = auVar81._0_4_;
          auVar269 = divps(auVar268,auVar81);
          auVar270._0_4_ = auVar269._0_4_ * fVar267;
          auVar270._4_4_ = auVar269._4_4_ * fVar267;
          auVar270._8_4_ = auVar269._8_4_ * fVar267;
          auVar270._12_4_ = auVar269._12_4_ * fVar267;
          auVar269 = roundps(auVar46,auVar270,1);
          auVar17._0_4_ = fVar267 + -1.0;
          auVar17._4_4_ = auVar17._0_4_;
          auVar17._8_4_ = auVar17._0_4_;
          auVar17._12_4_ = auVar17._0_4_;
          auVar269 = minps(auVar269,auVar17);
          auVar269 = maxps(auVar269,ZEXT816(0));
          fVar267 = auVar270._0_4_ - auVar269._0_4_;
          fVar281 = auVar270._4_4_ - auVar269._4_4_;
          fVar283 = auVar270._8_4_ - auVar269._8_4_;
          fVar285 = auVar270._12_4_ - auVar269._12_4_;
          iVar301 = (int)auVar269._0_4_;
          iVar310 = (int)auVar269._4_4_;
          iVar314 = (int)auVar269._8_4_;
          iVar317 = (int)auVar269._12_4_;
          local_78 = (Accel *)CONCAT44(iVar310,iVar301);
          uStack_70 = (RTCRayQueryContext *)CONCAT44(iVar317,iVar314);
          lVar14 = 0;
          if ((uVar10 & 0xff) != 0) {
            for (; ((uVar10 & 0xff) >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
            }
          }
          iVar13 = *(int *)((long)&local_78 + lVar14 * 4);
          pRVar12 = (RawBufferView *)(long)iVar13;
          auVar18._0_4_ = -(uint)(iVar13 == iVar301);
          auVar18._4_4_ = -(uint)(iVar13 == iVar310);
          auVar18._8_4_ = -(uint)(iVar13 == iVar314);
          auVar18._12_4_ = -(uint)(iVar13 == iVar317);
          iVar13 = movmskps(uVar37 << 8,~auVar18 & local_58);
          auVar269 = local_58;
          auVar108 = local_58;
          if (iVar13 == 0) {
            pRVar5 = (this_00->l2w_buf).items;
            pRVar7 = pRVar5 + (long)pRVar12;
            RVar3 = pRVar5[(long)pRVar12].format;
            if (RVar3 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
              pcVar6 = pRVar7->ptr_ofs;
              lVar14 = pRVar7->stride * uVar16;
              auVar269 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar14)),
                                  *(undefined4 *)(pcVar6 + lVar14 + 0x10),0x1c);
              auVar269 = insertps(auVar269,*(undefined4 *)(pcVar6 + lVar14 + 0x20),0x28);
              auVar127 = auVar269._0_12_;
              auVar269 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar14 + 4)),
                                  *(undefined4 *)(pcVar6 + lVar14 + 0x14),0x1c);
              auVar269 = insertps(auVar269,*(undefined4 *)(pcVar6 + lVar14 + 0x24),0x28);
              auVar256 = auVar269._0_12_;
              auVar269 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar14 + 8)),
                                  *(undefined4 *)(pcVar6 + lVar14 + 0x18),0x1c);
              auVar269 = insertps(auVar269,*(undefined4 *)(pcVar6 + lVar14 + 0x28),0x28);
              auVar245 = auVar269._0_12_;
              auVar269 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar14 + 0xc)),
                                  *(undefined4 *)(pcVar6 + lVar14 + 0x1c),0x1c);
              auVar269 = insertps(auVar269,*(undefined4 *)(pcVar6 + lVar14 + 0x2c),0x28);
              auVar215 = auVar269._0_12_;
            }
            else if (RVar3 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
              pcVar6 = pRVar7->ptr_ofs;
              lVar14 = pRVar7->stride * uVar16;
              auVar127._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar14 + 4);
              auVar127._0_4_ = *(undefined4 *)(pcVar6 + lVar14);
              auVar127._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar14 + 4) >> 0x20);
              auVar256._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar14 + 0x10);
              auVar256._0_4_ = *(undefined4 *)(pcVar6 + lVar14 + 0xc);
              auVar256._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar14 + 0x10) >> 0x20);
              auVar245._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar14 + 0x1c);
              auVar245._0_4_ = *(undefined4 *)(pcVar6 + lVar14 + 0x18);
              auVar245._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar14 + 0x1c) >> 0x20);
              auVar215._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar14 + 0x28);
              auVar215._0_4_ = *(undefined4 *)(pcVar6 + lVar14 + 0x24);
              auVar215._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar14 + 0x28) >> 0x20);
            }
            else if (RVar3 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
              pcVar6 = pRVar7->ptr_ofs;
              lVar14 = pRVar7->stride * uVar16;
              auVar246._8_8_ = 0;
              auVar246._0_8_ = *(ulong *)(pcVar6 + lVar14 + 0x10);
              auVar108 = insertps(auVar246,*(undefined4 *)(pcVar6 + lVar14 + 8),0x20);
              auVar128._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar14 + 0x34);
              auVar128._0_4_ = *(undefined4 *)(pcVar6 + lVar14);
              auVar128._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar14 + 0x34) >> 0x20);
              auVar128._12_4_ = 0;
              auVar216._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar14 + 0x1c);
              auVar216._0_4_ = *(undefined4 *)(pcVar6 + lVar14 + 0x18);
              auVar216._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar14 + 0x1c) >> 0x20);
              auVar216._12_4_ = 0;
              fVar105 = *(float *)(pcVar6 + lVar14 + 0x24);
              fVar106 = *(float *)(pcVar6 + lVar14 + 0x28);
              fVar119 = *(float *)(pcVar6 + lVar14 + 0x2c);
              fVar79 = *(float *)(pcVar6 + lVar14 + 0x30);
              fVar253 = fVar79 * fVar79 + fVar119 * fVar119 + fVar105 * fVar105 + fVar106 * fVar106;
              auVar269 = rsqrtss(ZEXT416((uint)fVar253),ZEXT416((uint)fVar253));
              fVar189 = auVar269._0_4_;
              auVar229._0_4_ = fVar253 * -0.5 * fVar189;
              auVar229._4_8_ = 0;
              auVar190._4_12_ = auVar269._4_12_;
              fVar189 = fVar189 * fVar189 * auVar229._0_4_ + fVar189 * 1.5;
              auVar269 = insertps(auVar216,ZEXT416((uint)(fVar105 * fVar189)),0x30);
              auVar215 = auVar269._0_12_;
              auVar269 = insertps(auVar128,ZEXT416((uint)(fVar106 * fVar189)),0x30);
              auVar127 = auVar269._0_12_;
              auVar190._0_4_ = fVar189 * fVar79;
              auVar130 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar14 + 0xc)),
                                  *(undefined4 *)(pcVar6 + lVar14 + 4),0x10);
              auVar269 = insertps(auVar108,auVar190,0x30);
              auVar245 = auVar269._0_12_;
              auVar269 = insertps(auVar130,*(undefined4 *)(pcVar6 + lVar14 + 0x3c),0x20);
              auVar269 = insertps(auVar269,ZEXT416((uint)(fVar119 * fVar189)),0x30);
              auVar256 = auVar269._0_12_;
            }
            else if (RVar3 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
              pcVar6 = pRVar7->ptr_ofs;
              lVar14 = pRVar7->stride * uVar16;
              auVar127 = SUB1612(*(undefined1 (*) [16])(pcVar6 + lVar14),0);
              auVar256 = SUB1612(*(undefined1 (*) [16])(pcVar6 + lVar14 + 0x10),0);
              auVar245 = SUB1612(*(undefined1 (*) [16])(pcVar6 + lVar14 + 0x20),0);
              auVar215 = SUB1612(*(undefined1 (*) [16])(pcVar6 + lVar14 + 0x30),0);
            }
            fVar105 = auVar127._0_4_;
            fVar106 = auVar127._4_4_;
            fVar119 = auVar127._8_4_;
            fVar120 = auVar256._0_4_;
            fVar124 = auVar256._4_4_;
            auVar257._8_4_ = auVar256._8_4_;
            auVar257._4_4_ = auVar257._8_4_;
            auVar257._0_4_ = auVar257._8_4_;
            fVar187 = auVar245._0_4_;
            fVar195 = auVar245._4_4_;
            fVar197 = auVar245._8_4_;
            fVar79 = auVar215._0_4_;
            fVar189 = auVar215._4_4_;
            fVar253 = auVar215._8_4_;
            auVar45._4_4_ = fVar189;
            auVar45._0_4_ = fVar189;
            auVar45._8_4_ = fVar189;
            RVar3 = pRVar7[1].format;
            if (RVar3 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
              pcVar6 = pRVar7[1].ptr_ofs;
              lVar14 = uVar16 * pRVar7[1].stride;
              auVar269 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar14)),
                                  *(undefined4 *)(pcVar6 + lVar14 + 0x10),0x1c);
              auVar269 = insertps(auVar269,*(undefined4 *)(pcVar6 + lVar14 + 0x20),0x28);
              auVar45 = auVar269._0_12_;
              auVar269 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar14 + 4)),
                                  *(undefined4 *)(pcVar6 + lVar14 + 0x14),0x1c);
              auVar269 = insertps(auVar269,*(undefined4 *)(pcVar6 + lVar14 + 0x24),0x28);
              v_15.field_0._0_12_ = auVar269._0_12_;
              auVar269 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar14 + 8)),
                                  *(undefined4 *)(pcVar6 + lVar14 + 0x18),0x1c);
              auVar269 = insertps(auVar269,*(undefined4 *)(pcVar6 + lVar14 + 0x28),0x28);
              auVar229 = auVar269._0_12_;
              auVar269 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar14 + 0xc)),
                                  *(undefined4 *)(pcVar6 + lVar14 + 0x1c),0x1c);
              auVar269 = insertps(auVar269,*(undefined4 *)(pcVar6 + lVar14 + 0x2c),0x28);
              auVar258 = auVar269._0_12_;
            }
            else if (RVar3 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
              pcVar6 = pRVar7[1].ptr_ofs;
              lVar14 = uVar16 * pRVar7[1].stride;
              auVar45._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar14 + 4);
              auVar45._0_4_ = *(undefined4 *)(pcVar6 + lVar14);
              auVar45._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar14 + 4) >> 0x20);
              v_15.field_0._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar14 + 0x10);
              v_15.field_0._0_4_ = *(undefined4 *)(pcVar6 + lVar14 + 0xc);
              v_15.field_0._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar14 + 0x10) >> 0x20);
              auVar229._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar14 + 0x1c);
              auVar229._0_4_ = (float)*(undefined4 *)(pcVar6 + lVar14 + 0x18);
              auVar229._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar14 + 0x1c) >> 0x20);
              auVar258._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar14 + 0x28);
              auVar258._0_4_ = *(undefined4 *)(pcVar6 + lVar14 + 0x24);
              auVar258._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar14 + 0x28) >> 0x20);
            }
            else if (RVar3 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
              pcVar6 = pRVar7[1].ptr_ofs;
              lVar14 = uVar16 * pRVar7[1].stride;
              auVar230._8_8_ = 0;
              auVar230._0_8_ = *(ulong *)(pcVar6 + lVar14 + 0x10);
              auVar108 = insertps(auVar230,*(undefined4 *)(pcVar6 + lVar14 + 8),0x20);
              auVar47._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar14 + 0x34);
              auVar47._0_4_ = *(undefined4 *)(pcVar6 + lVar14);
              auVar47._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar14 + 0x34) >> 0x20);
              auVar47._12_4_ = 0;
              auVar259._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar14 + 0x1c);
              auVar259._0_4_ = *(undefined4 *)(pcVar6 + lVar14 + 0x18);
              auVar259._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar14 + 0x1c) >> 0x20);
              auVar259._12_4_ = 0;
              fVar121 = *(float *)(pcVar6 + lVar14 + 0x24);
              fVar122 = *(float *)(pcVar6 + lVar14 + 0x28);
              fVar123 = *(float *)(pcVar6 + lVar14 + 0x2c);
              fVar125 = *(float *)(pcVar6 + lVar14 + 0x30);
              fVar139 = fVar125 * fVar125 +
                        fVar123 * fVar123 + fVar121 * fVar121 + fVar122 * fVar122;
              auVar269 = rsqrtss(ZEXT416((uint)fVar139),ZEXT416((uint)fVar139));
              fVar126 = auVar269._0_4_;
              auVar82._4_12_ = auVar269._4_12_;
              fVar126 = fVar126 * fVar126 * fVar139 * -0.5 * fVar126 + fVar126 * 1.5;
              auVar269 = insertps(auVar259,ZEXT416((uint)(fVar121 * fVar126)),0x30);
              auVar258 = auVar269._0_12_;
              auVar269 = insertps(auVar47,ZEXT416((uint)(fVar122 * fVar126)),0x30);
              auVar45 = auVar269._0_12_;
              auVar82._0_4_ = fVar126 * fVar125;
              auVar130 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar14 + 0xc)),
                                  *(undefined4 *)(pcVar6 + lVar14 + 4),0x10);
              auVar269 = insertps(auVar108,auVar82,0x30);
              auVar229 = auVar269._0_12_;
              auVar269 = insertps(auVar130,*(undefined4 *)(pcVar6 + lVar14 + 0x3c),0x20);
              auVar269 = insertps(auVar269,ZEXT416((uint)(fVar123 * fVar126)),0x30);
              v_15.field_0._0_12_ = auVar269._0_12_;
            }
            else {
              auVar258 = auVar257;
              if (RVar3 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
                pcVar6 = pRVar7[1].ptr_ofs;
                lVar14 = uVar16 * pRVar7[1].stride;
                auVar45 = SUB1612(*(undefined1 (*) [16])(pcVar6 + lVar14),0);
                v_15.field_0._0_12_ = SUB1612(*(undefined1 (*) [16])(pcVar6 + lVar14 + 0x10),0);
                auVar229 = SUB1612(*(undefined1 (*) [16])(pcVar6 + lVar14 + 0x20),0);
                auVar258 = SUB1612(*(undefined1 (*) [16])(pcVar6 + lVar14 + 0x30),0);
              }
            }
            fVar121 = auVar45._0_4_;
            fVar122 = auVar45._4_4_;
            fVar123 = auVar45._8_4_;
            fVar188 = 1.0 - fVar267;
            fVar194 = 1.0 - fVar281;
            fVar196 = 1.0 - fVar283;
            fVar198 = 1.0 - fVar285;
            fVar199 = fVar105 * fVar188 + fVar121 * fVar267;
            fVar212 = fVar105 * fVar194 + fVar121 * fVar281;
            fVar213 = fVar105 * fVar196 + fVar121 * fVar283;
            fVar214 = fVar105 * fVar198 + fVar121 * fVar285;
            fVar286 = fVar106 * fVar188 + fVar122 * fVar267;
            fVar295 = fVar106 * fVar194 + fVar122 * fVar281;
            fVar296 = fVar106 * fVar196 + fVar122 * fVar283;
            fVar298 = fVar106 * fVar198 + fVar122 * fVar285;
            fVar125 = fVar119 * fVar188 + fVar123 * fVar267;
            fVar139 = fVar119 * fVar194 + fVar123 * fVar281;
            fVar141 = fVar119 * fVar196 + fVar123 * fVar283;
            fVar143 = fVar119 * fVar198 + fVar123 * fVar285;
            fVar106 = v_15.field_0._0_4_;
            fVar126 = v_15.field_0._4_4_;
            fVar144 = v_15.field_0._8_4_;
            fVar105 = fVar120 * fVar188 + fVar106 * fVar267;
            fVar119 = fVar120 * fVar194 + fVar106 * fVar281;
            fVar121 = fVar120 * fVar196 + fVar106 * fVar283;
            fVar123 = fVar120 * fVar198 + fVar106 * fVar285;
            fVar106 = fVar124 * fVar188 + fVar126 * fVar267;
            fVar120 = fVar124 * fVar194 + fVar126 * fVar281;
            fVar122 = fVar124 * fVar196 + fVar126 * fVar283;
            fVar124 = fVar124 * fVar198 + fVar126 * fVar285;
            fVar126 = auVar257._8_4_ * fVar188 + fVar144 * fVar267;
            fVar140 = auVar257._8_4_ * fVar194 + fVar144 * fVar281;
            fVar142 = auVar257._8_4_ * fVar196 + fVar144 * fVar283;
            fVar144 = auVar257._8_4_ * fVar198 + fVar144 * fVar285;
            fVar227 = auVar229._0_4_;
            fVar228 = auVar229._4_4_;
            fVar238 = auVar229._8_4_;
            fVar145 = fVar187 * fVar188 + fVar227 * fVar267;
            fVar185 = fVar187 * fVar194 + fVar227 * fVar281;
            fVar186 = fVar187 * fVar196 + fVar227 * fVar283;
            fVar187 = fVar187 * fVar198 + fVar227 * fVar285;
            fVar302 = fVar195 * fVar188 + fVar228 * fVar267;
            fVar311 = fVar195 * fVar194 + fVar228 * fVar281;
            fVar315 = fVar195 * fVar196 + fVar228 * fVar283;
            fVar318 = fVar195 * fVar198 + fVar228 * fVar285;
            fVar195 = auVar258._0_4_;
            fVar243 = auVar258._4_4_;
            fVar312 = auVar258._8_4_;
            fVar244 = fVar197 * fVar188 + fVar238 * fVar267;
            fVar252 = fVar197 * fVar194 + fVar238 * fVar281;
            fVar254 = fVar197 * fVar196 + fVar238 * fVar283;
            fVar255 = fVar197 * fVar198 + fVar238 * fVar285;
            fVar227 = fVar79 * fVar188 + fVar195 * fVar267;
            fVar238 = fVar79 * fVar194 + fVar195 * fVar281;
            fVar240 = fVar79 * fVar196 + fVar195 * fVar283;
            fVar242 = fVar79 * fVar198 + fVar195 * fVar285;
            fVar228 = fVar189 * fVar188 + fVar243 * fVar267;
            fVar239 = fVar189 * fVar194 + fVar243 * fVar281;
            fVar241 = fVar189 * fVar196 + fVar243 * fVar283;
            fVar243 = fVar189 * fVar198 + fVar243 * fVar285;
            fVar189 = fVar188 * fVar253 + fVar312 * fVar267;
            fVar195 = fVar194 * fVar253 + fVar312 * fVar281;
            fVar197 = fVar196 * fVar253 + fVar312 * fVar283;
            fVar188 = fVar198 * fVar253 + fVar312 * fVar285;
            fVar267 = fVar106 * fVar244 - fVar126 * fVar302;
            fVar281 = fVar120 * fVar252 - fVar140 * fVar311;
            auVar129._4_4_ = fVar281;
            auVar129._0_4_ = fVar267;
            fVar283 = fVar122 * fVar254 - fVar142 * fVar315;
            fVar285 = fVar124 * fVar255 - fVar144 * fVar318;
            auVar217._0_4_ = fVar126 * fVar145 - fVar105 * fVar244;
            auVar217._4_4_ = fVar140 * fVar185 - fVar119 * fVar252;
            auVar217._8_4_ = fVar142 * fVar186 - fVar121 * fVar254;
            auVar217._12_4_ = fVar144 * fVar187 - fVar123 * fVar255;
            auVar271._0_4_ = fVar105 * fVar302 - fVar106 * fVar145;
            auVar271._4_4_ = fVar119 * fVar311 - fVar120 * fVar185;
            auVar271._8_4_ = fVar121 * fVar315 - fVar122 * fVar186;
            auVar271._12_4_ = fVar123 * fVar318 - fVar124 * fVar187;
            auVar260._0_4_ = fVar125 * fVar302 - fVar286 * fVar244;
            auVar260._4_4_ = fVar139 * fVar311 - fVar295 * fVar252;
            auVar260._8_4_ = fVar141 * fVar315 - fVar296 * fVar254;
            auVar260._12_4_ = fVar143 * fVar318 - fVar298 * fVar255;
            auVar247._0_4_ = fVar244 * fVar199 - fVar125 * fVar145;
            auVar247._4_4_ = fVar252 * fVar212 - fVar139 * fVar185;
            auVar247._8_4_ = fVar254 * fVar213 - fVar141 * fVar186;
            auVar247._12_4_ = fVar255 * fVar214 - fVar143 * fVar187;
            auVar147._0_4_ = fVar145 * fVar286 - fVar302 * fVar199;
            auVar147._4_4_ = fVar185 * fVar295 - fVar311 * fVar212;
            auVar147._8_4_ = fVar186 * fVar296 - fVar315 * fVar213;
            auVar147._12_4_ = fVar187 * fVar298 - fVar318 * fVar214;
            auVar304._0_4_ = fVar286 * fVar126 - fVar125 * fVar106;
            auVar304._4_4_ = fVar295 * fVar140 - fVar139 * fVar120;
            auVar304._8_4_ = fVar296 * fVar142 - fVar141 * fVar122;
            auVar304._12_4_ = fVar298 * fVar144 - fVar143 * fVar124;
            auVar322._0_4_ = fVar125 * fVar105 - fVar126 * fVar199;
            auVar322._4_4_ = fVar139 * fVar119 - fVar140 * fVar212;
            auVar322._8_4_ = fVar141 * fVar121 - fVar142 * fVar213;
            auVar322._12_4_ = fVar143 * fVar123 - fVar144 * fVar214;
            auVar107._0_4_ = fVar106 * fVar199 - fVar105 * fVar286;
            auVar107._4_4_ = fVar120 * fVar212 - fVar119 * fVar295;
            auVar107._8_4_ = fVar122 * fVar213 - fVar121 * fVar296;
            auVar107._12_4_ = fVar124 * fVar214 - fVar123 * fVar298;
            auVar200._0_4_ = fVar199 * fVar267 + fVar286 * auVar217._0_4_ + fVar125 * auVar271._0_4_
            ;
            auVar200._4_4_ = fVar212 * fVar281 + fVar295 * auVar217._4_4_ + fVar139 * auVar271._4_4_
            ;
            auVar200._8_4_ = fVar213 * fVar283 + fVar296 * auVar217._8_4_ + fVar141 * auVar271._8_4_
            ;
            auVar200._12_4_ =
                 fVar214 * fVar285 + fVar298 * auVar217._12_4_ + fVar143 * auVar271._12_4_;
            auVar129._8_4_ = fVar283;
            auVar129._12_4_ = fVar285;
            auVar130 = divps(auVar129,auVar200);
            auVar261 = divps(auVar260,auVar200);
            auVar305 = divps(auVar304,auVar200);
            auVar218 = divps(auVar217,auVar200);
            _local_2a8 = divps(auVar247,auVar200);
            auVar323 = divps(auVar322,auVar200);
            auVar269 = divps(auVar271,auVar200);
            _local_298 = divps(auVar147,auVar200);
            auVar108 = divps(auVar107,auVar200);
            fVar267 = fVar227 * auVar130._0_4_ + fVar228 * auVar218._0_4_ + fVar189 * auVar269._0_4_
            ;
            fVar281 = fVar238 * auVar130._4_4_ + fVar239 * auVar218._4_4_ + fVar195 * auVar269._4_4_
            ;
            fVar283 = fVar240 * auVar130._8_4_ + fVar241 * auVar218._8_4_ + fVar197 * auVar269._8_4_
            ;
            fVar285 = fVar242 * auVar130._12_4_ +
                      fVar243 * auVar218._12_4_ + fVar188 * auVar269._12_4_;
            fVar105 = fVar227 * auVar261._0_4_ +
                      fVar228 * local_2a8._0_4_ + fVar189 * local_298._0_4_;
            fVar106 = fVar238 * auVar261._4_4_ +
                      fVar239 * local_2a8._4_4_ + fVar195 * local_298._4_4_;
            fVar119 = fVar240 * auVar261._8_4_ +
                      fVar241 * local_2a8._8_4_ + fVar197 * local_298._8_4_;
            fVar79 = fVar242 * auVar261._12_4_ +
                     fVar243 * local_2a8._12_4_ + fVar188 * local_298._12_4_;
            fVar189 = fVar227 * auVar305._0_4_ + fVar228 * auVar323._0_4_ + fVar189 * auVar108._0_4_
            ;
            fVar253 = fVar238 * auVar305._4_4_ + fVar239 * auVar323._4_4_ + fVar195 * auVar108._4_4_
            ;
            fVar187 = fVar240 * auVar305._8_4_ + fVar241 * auVar323._8_4_ + fVar197 * auVar108._8_4_
            ;
            fVar195 = fVar242 * auVar305._12_4_ +
                      fVar243 * auVar323._12_4_ + fVar188 * auVar108._12_4_;
          }
          else {
            while( true ) {
              uVar10 = movmskps((int)pRVar12,auVar269);
              if (uVar10 == 0) break;
              lVar14 = 0;
              if ((uVar10 & 0xff) != 0) {
                for (; ((uVar10 & 0xff) >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
                }
              }
              iVar13 = *(int *)((long)&local_78 + (long)(int)lVar14 * 4);
              auVar19._0_4_ = -(uint)(iVar13 == iVar301);
              auVar19._4_4_ = -(uint)(iVar13 == iVar310);
              auVar19._8_4_ = -(uint)(iVar13 == iVar314);
              auVar19._12_4_ = -(uint)(iVar13 == iVar317);
              auVar19 = auVar19 & auVar269;
              pRVar7 = (this_00->l2w_buf).items;
              pRVar12 = pRVar7 + iVar13;
              RVar3 = pRVar7[iVar13].format;
              if (RVar3 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
                pcVar6 = pRVar12->ptr_ofs;
                lVar14 = pRVar12->stride * uVar16;
                auVar130 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar14)),
                                    *(undefined4 *)(pcVar6 + lVar14 + 0x10),0x1c);
                in_XMM13 = insertps(auVar130,*(undefined4 *)(pcVar6 + lVar14 + 0x20),0x28);
                auVar130 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar14 + 4)),
                                    *(undefined4 *)(pcVar6 + lVar14 + 0x14),0x1c);
                in_XMM9 = insertps(auVar130,*(undefined4 *)(pcVar6 + lVar14 + 0x24),0x28);
                auVar130 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar14 + 8)),
                                    *(undefined4 *)(pcVar6 + lVar14 + 0x18),0x1c);
                _local_298 = insertps(auVar130,*(undefined4 *)(pcVar6 + lVar14 + 0x28),0x28);
                auVar130 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar14 + 0xc)),
                                    *(undefined4 *)(pcVar6 + lVar14 + 0x1c),0x1c);
                in_XMM7 = insertps(auVar130,*(undefined4 *)(pcVar6 + lVar14 + 0x2c),0x28);
              }
              else if (RVar3 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
                pcVar6 = pRVar12->ptr_ofs;
                lVar14 = pRVar12->stride * uVar16;
                in_XMM13._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar14 + 4);
                in_XMM13._0_4_ = *(undefined4 *)(pcVar6 + lVar14);
                in_XMM13._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar14 + 4) >> 0x20);
                in_XMM13._12_4_ = 0;
                in_XMM9._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar14 + 0x10);
                in_XMM9._0_4_ = *(undefined4 *)(pcVar6 + lVar14 + 0xc);
                in_XMM9._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar14 + 0x10) >> 0x20);
                in_XMM9._12_4_ = 0;
                local_298._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar14 + 0x1c);
                local_298._0_4_ = *(undefined4 *)(pcVar6 + lVar14 + 0x18);
                fStack_290 = (float)(int)((ulong)*(undefined8 *)(pcVar6 + lVar14 + 0x1c) >> 0x20);
                fStack_28c = 0.0;
                in_XMM7._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar14 + 0x28);
                in_XMM7._0_4_ = *(undefined4 *)(pcVar6 + lVar14 + 0x24);
                in_XMM7._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar14 + 0x28) >> 0x20);
                in_XMM7._12_4_ = 0;
              }
              else if (RVar3 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
                pcVar6 = pRVar12->ptr_ofs;
                lVar14 = pRVar12->stride * uVar16;
                auVar272._8_8_ = 0;
                auVar272._0_8_ = *(ulong *)(pcVar6 + lVar14 + 0x10);
                auVar218 = insertps(auVar272,*(undefined4 *)(pcVar6 + lVar14 + 8),0x20);
                auVar288._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar14 + 0x34);
                auVar288._0_4_ = *(undefined4 *)(pcVar6 + lVar14);
                auVar288._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar14 + 0x34) >> 0x20);
                auVar288._12_4_ = 0;
                auVar201._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar14 + 0x1c);
                auVar201._0_4_ = *(undefined4 *)(pcVar6 + lVar14 + 0x18);
                auVar201._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar14 + 0x1c) >> 0x20);
                auVar201._12_4_ = 0;
                fVar105 = *(float *)(pcVar6 + lVar14 + 0x24);
                fVar106 = *(float *)(pcVar6 + lVar14 + 0x28);
                fVar119 = *(float *)(pcVar6 + lVar14 + 0x2c);
                fVar79 = *(float *)(pcVar6 + lVar14 + 0x30);
                fVar253 = fVar79 * fVar79 +
                          fVar119 * fVar119 + fVar105 * fVar105 + fVar106 * fVar106;
                auVar130 = rsqrtss(ZEXT416((uint)fVar253),ZEXT416((uint)fVar253));
                fVar189 = auVar130._0_4_;
                fVar189 = fVar189 * fVar189 * fVar253 * -0.5 * fVar189 + fVar189 * 1.5;
                in_XMM7 = insertps(auVar201,ZEXT416((uint)(fVar105 * fVar189)),0x30);
                in_XMM13 = insertps(auVar288,ZEXT416((uint)(fVar106 * fVar189)),0x30);
                auVar109._0_4_ = fVar189 * fVar79;
                auVar109._4_12_ = auVar130._4_12_;
                auVar130 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar14 + 0xc)),
                                    *(undefined4 *)(pcVar6 + lVar14 + 4),0x10);
                _local_298 = insertps(auVar218,auVar109,0x30);
                auVar130 = insertps(auVar130,*(undefined4 *)(pcVar6 + lVar14 + 0x3c),0x20);
                in_XMM9 = insertps(auVar130,ZEXT416((uint)(fVar119 * fVar189)),0x30);
              }
              else if (RVar3 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
                pcVar6 = pRVar12->ptr_ofs;
                lVar14 = pRVar12->stride * uVar16;
                in_XMM13 = *(undefined1 (*) [16])(pcVar6 + lVar14);
                in_XMM9 = *(undefined1 (*) [16])(pcVar6 + lVar14 + 0x10);
                _local_298 = *(undefined1 (*) [16])(pcVar6 + lVar14 + 0x20);
                in_XMM7 = *(undefined1 (*) [16])(pcVar6 + lVar14 + 0x30);
              }
              uVar80 = in_XMM13._0_4_;
              uVar102 = in_XMM13._4_4_;
              uVar103 = in_XMM13._8_4_;
              auVar48._4_4_ = uVar80;
              auVar48._0_4_ = uVar80;
              auVar48._8_4_ = uVar80;
              auVar48._12_4_ = uVar80;
              _local_258 = blendvps(_local_258,auVar48,auVar19);
              auVar49._4_4_ = uVar102;
              auVar49._0_4_ = uVar102;
              auVar49._8_4_ = uVar102;
              auVar49._12_4_ = uVar102;
              _local_168 = blendvps(_local_168,auVar49,auVar19);
              auVar50._4_4_ = uVar103;
              auVar50._0_4_ = uVar103;
              auVar50._8_4_ = uVar103;
              auVar50._12_4_ = uVar103;
              _local_268 = blendvps(_local_268,auVar50,auVar19);
              uVar80 = in_XMM9._0_4_;
              uVar102 = in_XMM9._4_4_;
              uVar103 = in_XMM9._8_4_;
              auVar51._4_4_ = uVar80;
              auVar51._0_4_ = uVar80;
              auVar51._8_4_ = uVar80;
              auVar51._12_4_ = uVar80;
              _local_278 = blendvps(_local_278,auVar51,auVar19);
              auVar52._4_4_ = uVar102;
              auVar52._0_4_ = uVar102;
              auVar52._8_4_ = uVar102;
              auVar52._12_4_ = uVar102;
              _local_248 = blendvps(_local_248,auVar52,auVar19);
              auVar53._4_4_ = uVar103;
              auVar53._0_4_ = uVar103;
              auVar53._8_4_ = uVar103;
              auVar53._12_4_ = uVar103;
              _local_208 = blendvps(_local_208,auVar53,auVar19);
              uVar80 = local_298._0_4_;
              uVar102 = local_298._4_4_;
              uVar103 = local_298._8_4_;
              auVar54._4_4_ = uVar80;
              auVar54._0_4_ = uVar80;
              auVar54._8_4_ = uVar80;
              auVar54._12_4_ = uVar80;
              auVar108 = blendvps(auVar108,auVar54,auVar19);
              auVar55._4_4_ = uVar102;
              auVar55._0_4_ = uVar102;
              auVar55._8_4_ = uVar102;
              auVar55._12_4_ = uVar102;
              _local_1b8 = blendvps(_local_1b8,auVar55,auVar19);
              auVar56._4_4_ = uVar103;
              auVar56._0_4_ = uVar103;
              auVar56._8_4_ = uVar103;
              auVar56._12_4_ = uVar103;
              in_XMM4 = blendvps(in_XMM4,auVar56,auVar19);
              uVar80 = in_XMM7._0_4_;
              uVar102 = in_XMM7._4_4_;
              uVar103 = in_XMM7._8_4_;
              auVar57._4_4_ = uVar80;
              auVar57._0_4_ = uVar80;
              auVar57._8_4_ = uVar80;
              auVar57._12_4_ = uVar80;
              auVar110 = blendvps(auVar110,auVar57,auVar19);
              auVar58._4_4_ = uVar102;
              auVar58._0_4_ = uVar102;
              auVar58._8_4_ = uVar102;
              auVar58._12_4_ = uVar102;
              in_XMM6 = blendvps(in_XMM6,auVar58,auVar19);
              auVar59._4_4_ = uVar103;
              auVar59._0_4_ = uVar103;
              auVar59._8_4_ = uVar103;
              auVar59._12_4_ = uVar103;
              _local_288 = blendvps(_local_288,auVar59,auVar19);
              RVar3 = pRVar12[1].format;
              if (RVar3 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
                pcVar6 = pRVar12[1].ptr_ofs;
                pRVar12 = (RawBufferView *)(pRVar12[1].stride * uVar16);
                auVar130 = insertps(ZEXT416(*(uint *)((long)&pRVar12->ptr_ofs + (long)pcVar6)),
                                    *(undefined4 *)((long)&pRVar12->stride + (long)pcVar6),0x1c);
                _local_2a8 = insertps(auVar130,*(undefined4 *)
                                                ((long)&pRVar12->format + (long)pcVar6),0x28);
                auVar130 = insertps(ZEXT416(*(uint *)((long)&pRVar12->ptr_ofs + (long)(pcVar6 + 4)))
                                    ,*(undefined4 *)((long)&pRVar12->stride + (long)(pcVar6 + 4)),
                                    0x1c);
                in_XMM11 = insertps(auVar130,*(undefined4 *)
                                              ((long)&pRVar12->modCounter + (long)pcVar6),0x28);
                auVar130 = insertps(ZEXT416(*(uint *)((long)&pRVar12->dptr_ofs + (long)pcVar6)),
                                    *(undefined4 *)((long)&pRVar12->num + (long)pcVar6),0x1c);
                in_XMM10 = insertps(auVar130,*(undefined4 *)(&pRVar12->modified + (long)pcVar6),0x28
                                   );
                auVar130 = insertps(ZEXT416(*(uint *)((long)&pRVar12->dptr_ofs + (long)(pcVar6 + 4))
                                           ),*(undefined4 *)
                                              ((long)&pRVar12->num + (long)(pcVar6 + 4)),0x1c);
                in_XMM8 = insertps(auVar130,*(undefined4 *)((long)&pRVar12->userData + (long)pcVar6)
                                   ,0x28);
              }
              else if (RVar3 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
                pcVar6 = pRVar12[1].ptr_ofs;
                pRVar12 = (RawBufferView *)(pRVar12[1].stride * uVar16);
                uVar2 = *(undefined8 *)((long)&pRVar12->ptr_ofs + (long)(pcVar6 + 4));
                local_2a8._4_4_ = (int)uVar2;
                local_2a8._0_4_ = *(undefined4 *)((long)&pRVar12->ptr_ofs + (long)pcVar6);
                fStack_2a0 = (float)(int)((ulong)uVar2 >> 0x20);
                fStack_29c = 0.0;
                uVar2 = *(undefined8 *)((long)&pRVar12->stride + (long)pcVar6);
                in_XMM11._4_4_ = (int)uVar2;
                in_XMM11._0_4_ = *(undefined4 *)((long)&pRVar12->dptr_ofs + (long)(pcVar6 + 4));
                in_XMM11._8_4_ = (int)((ulong)uVar2 >> 0x20);
                in_XMM11._12_4_ = 0;
                uVar2 = *(undefined8 *)((long)&pRVar12->num + (long)(pcVar6 + 4));
                in_XMM10._4_4_ = (int)uVar2;
                in_XMM10._0_4_ = *(undefined4 *)((long)&pRVar12->num + (long)pcVar6);
                in_XMM10._8_4_ = (int)((ulong)uVar2 >> 0x20);
                in_XMM10._12_4_ = 0;
                in_XMM8._4_4_ = (int)*(undefined8 *)(&pRVar12->modified + (long)pcVar6);
                in_XMM8._0_4_ = *(undefined4 *)((long)&pRVar12->modCounter + (long)pcVar6);
                in_XMM8._8_4_ =
                     (int)((ulong)*(undefined8 *)(&pRVar12->modified + (long)pcVar6) >> 0x20);
                in_XMM8._12_4_ = 0;
              }
              else if (RVar3 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
                pcVar6 = pRVar12[1].ptr_ofs;
                pRVar12 = (RawBufferView *)(pRVar12[1].stride * uVar16);
                auVar273._8_8_ = 0;
                auVar273._0_8_ = *(ulong *)((long)&pRVar12->stride + (long)pcVar6);
                auVar218 = insertps(auVar273,*(undefined4 *)
                                              ((long)&pRVar12->dptr_ofs + (long)pcVar6),0x20);
                auVar83._4_4_ = (int)*(undefined8 *)(pcVar6 + 4 + (long)&(pRVar12->buffer).ptr);
                auVar83._0_4_ = *(undefined4 *)((long)&pRVar12->ptr_ofs + (long)pcVar6);
                uVar2 = *(undefined8 *)((long)&pRVar12->num + (long)(pcVar6 + 4));
                auVar219._4_4_ = (int)uVar2;
                auVar219._0_4_ = *(undefined4 *)((long)&pRVar12->num + (long)pcVar6);
                auVar219._8_4_ = (int)((ulong)uVar2 >> 0x20);
                auVar219._12_4_ = 0;
                fVar105 = *(float *)((long)&pRVar12->modCounter + (long)pcVar6);
                fVar106 = *(float *)(&pRVar12->modified + (long)pcVar6);
                fVar119 = *(float *)((long)&pRVar12->userData + (long)pcVar6);
                fVar79 = *(float *)(pcVar6 + (long)&(pRVar12->buffer).ptr);
                fVar253 = fVar79 * fVar79 +
                          fVar119 * fVar119 + fVar105 * fVar105 + fVar106 * fVar106;
                auVar130 = rsqrtss(ZEXT416((uint)fVar253),ZEXT416((uint)fVar253));
                fVar189 = auVar130._0_4_;
                fVar189 = fVar189 * fVar189 * fVar253 * -0.5 * fVar189 + fVar189 * 1.5;
                in_XMM8 = insertps(auVar219,ZEXT416((uint)(fVar105 * fVar189)),0x30);
                auVar83._8_4_ =
                     (int)((ulong)*(undefined8 *)(pcVar6 + 4 + (long)&(pRVar12->buffer).ptr) >> 0x20
                          );
                auVar83._12_4_ = 0;
                _local_2a8 = insertps(auVar83,ZEXT416((uint)(fVar106 * fVar189)),0x30);
                auVar131._0_4_ = fVar189 * fVar79;
                auVar131._4_12_ = auVar130._4_12_;
                auVar130 = insertps(ZEXT416(*(uint *)((long)&pRVar12->dptr_ofs + (long)(pcVar6 + 4))
                                           ),*(undefined4 *)
                                              ((long)&pRVar12->ptr_ofs + (long)(pcVar6 + 4)),0x10);
                in_XMM10 = insertps(auVar218,auVar131,0x30);
                auVar130 = insertps(auVar130,*(undefined4 *)
                                              ((long)&pRVar12[1].ptr_ofs + (long)(pcVar6 + 4)),0x20)
                ;
                in_XMM11 = insertps(auVar130,ZEXT416((uint)(fVar119 * fVar189)),0x30);
              }
              else if (RVar3 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
                pcVar6 = pRVar12[1].ptr_ofs;
                pRVar12 = (RawBufferView *)(pRVar12[1].stride * uVar16);
                _local_2a8 = *(undefined1 (*) [16])((long)&pRVar12->ptr_ofs + (long)pcVar6);
                in_XMM11 = *(undefined1 (*) [16])((long)&pRVar12->stride + (long)pcVar6);
                in_XMM10 = *(undefined1 (*) [16])((long)&pRVar12->format + (long)pcVar6);
                in_XMM8 = *(undefined1 (*) [16])(pcVar6 + (long)&(pRVar12->buffer).ptr);
              }
              uVar80 = local_2a8._0_4_;
              uVar102 = local_2a8._4_4_;
              uVar103 = local_2a8._8_4_;
              auVar60._4_4_ = uVar80;
              auVar60._0_4_ = uVar80;
              auVar60._8_4_ = uVar80;
              auVar60._12_4_ = uVar80;
              _local_158 = blendvps(_local_158,auVar60,auVar19);
              auVar61._4_4_ = uVar102;
              auVar61._0_4_ = uVar102;
              auVar61._8_4_ = uVar102;
              auVar61._12_4_ = uVar102;
              _local_148 = blendvps(_local_148,auVar61,auVar19);
              uVar104 = in_XMM10._0_4_;
              uVar282 = in_XMM10._4_4_;
              uVar284 = in_XMM10._8_4_;
              auVar62._4_4_ = uVar103;
              auVar62._0_4_ = uVar103;
              auVar62._8_4_ = uVar103;
              auVar62._12_4_ = uVar103;
              _local_178 = blendvps(_local_178,auVar62,auVar19);
              uVar80 = in_XMM11._0_4_;
              uVar102 = in_XMM11._4_4_;
              uVar103 = in_XMM11._8_4_;
              auVar63._4_4_ = uVar80;
              auVar63._0_4_ = uVar80;
              auVar63._8_4_ = uVar80;
              auVar63._12_4_ = uVar80;
              _local_1a8 = blendvps(_local_1a8,auVar63,auVar19);
              auVar64._4_4_ = uVar102;
              auVar64._0_4_ = uVar102;
              auVar64._8_4_ = uVar102;
              auVar64._12_4_ = uVar102;
              _local_1f8 = blendvps(_local_1f8,auVar64,auVar19);
              auVar65._4_4_ = uVar103;
              auVar65._0_4_ = uVar103;
              auVar65._8_4_ = uVar103;
              auVar65._12_4_ = uVar103;
              _local_138 = blendvps(_local_138,auVar65,auVar19);
              auVar66._4_4_ = uVar104;
              auVar66._0_4_ = uVar104;
              auVar66._8_4_ = uVar104;
              auVar66._12_4_ = uVar104;
              _local_218 = blendvps(_local_218,auVar66,auVar19);
              auVar67._4_4_ = uVar282;
              auVar67._0_4_ = uVar282;
              auVar67._8_4_ = uVar282;
              auVar67._12_4_ = uVar282;
              _local_238 = blendvps(_local_238,auVar67,auVar19);
              auVar68._4_4_ = uVar284;
              auVar68._0_4_ = uVar284;
              auVar68._8_4_ = uVar284;
              auVar68._12_4_ = uVar284;
              _local_228 = blendvps(_local_228,auVar68,auVar19);
              uVar80 = in_XMM8._0_4_;
              uVar102 = in_XMM8._4_4_;
              uVar103 = in_XMM8._8_4_;
              auVar69._4_4_ = uVar80;
              auVar69._0_4_ = uVar80;
              auVar69._8_4_ = uVar80;
              auVar69._12_4_ = uVar80;
              _local_1e8 = blendvps(_local_1e8,auVar69,auVar19);
              auVar70._4_4_ = uVar102;
              auVar70._0_4_ = uVar102;
              auVar70._8_4_ = uVar102;
              auVar70._12_4_ = uVar102;
              _local_1d8 = blendvps(_local_1d8,auVar70,auVar19);
              auVar71._4_4_ = uVar103;
              auVar71._0_4_ = uVar103;
              auVar71._8_4_ = uVar103;
              auVar71._12_4_ = uVar103;
              _local_1c8 = blendvps(_local_1c8,auVar71,auVar19);
              auVar269 = auVar269 ^ auVar19;
            }
            fVar105 = 1.0 - fVar267;
            fVar106 = 1.0 - fVar281;
            fVar119 = 1.0 - fVar283;
            fVar79 = 1.0 - fVar285;
            fVar296 = (float)local_258._0_4_ * fVar105 + (float)local_158._0_4_ * fVar267;
            fVar298 = (float)local_258._4_4_ * fVar106 + (float)local_158._4_4_ * fVar281;
            fVar302 = (float)uStack_250 * fVar119 + fStack_150 * fVar283;
            fVar311 = uStack_250._4_4_ * fVar79 + fStack_14c * fVar285;
            fVar198 = (float)local_168._0_4_ * fVar105 + (float)local_148._0_4_ * fVar267;
            fVar199 = (float)local_168._4_4_ * fVar106 + (float)local_148._4_4_ * fVar281;
            fVar212 = fStack_160 * fVar119 + fStack_140 * fVar283;
            fVar213 = fStack_15c * fVar79 + fStack_13c * fVar285;
            fVar186 = (float)local_268._0_4_ * fVar105 + (float)local_178._0_4_ * fVar267;
            fVar188 = (float)local_268._4_4_ * fVar106 + (float)local_178._4_4_ * fVar281;
            fVar194 = (float)uStack_260 * fVar119 + fStack_170 * fVar283;
            fVar196 = uStack_260._4_4_ * fVar79 + fStack_16c * fVar285;
            fVar214 = (float)local_278._0_4_ * fVar105 + (float)local_1a8._0_4_ * fVar267;
            fVar227 = (float)local_278._4_4_ * fVar106 + (float)local_1a8._4_4_ * fVar281;
            fVar228 = (float)uStack_270 * fVar119 + fStack_1a0 * fVar283;
            fVar238 = uStack_270._4_4_ * fVar79 + fStack_19c * fVar285;
            fVar243 = (float)local_248._0_4_ * fVar105 + (float)local_1f8._0_4_ * fVar267;
            fVar244 = (float)local_248._4_4_ * fVar106 + (float)local_1f8._4_4_ * fVar281;
            fVar252 = (float)uStack_240 * fVar119 + fStack_1f0 * fVar283;
            fVar254 = uStack_240._4_4_ * fVar79 + fStack_1ec * fVar285;
            fVar122 = (float)local_208._0_4_ * fVar105 + (float)local_138._0_4_ * fVar267;
            fVar123 = (float)local_208._4_4_ * fVar106 + (float)local_138._4_4_ * fVar281;
            fVar125 = (float)uStack_200 * fVar119 + fStack_130 * fVar283;
            fVar126 = uStack_200._4_4_ * fVar79 + fStack_12c * fVar285;
            fVar139 = auVar108._0_4_ * fVar105 + (float)local_218._0_4_ * fVar267;
            fVar140 = auVar108._4_4_ * fVar106 + (float)local_218._4_4_ * fVar281;
            fVar141 = auVar108._8_4_ * fVar119 + fStack_210 * fVar283;
            fVar142 = auVar108._12_4_ * fVar79 + fStack_20c * fVar285;
            fVar255 = (float)local_1b8._0_4_ * fVar105 + (float)local_238._0_4_ * fVar267;
            fVar312 = (float)local_1b8._4_4_ * fVar106 + (float)local_238._4_4_ * fVar281;
            fVar286 = fStack_1b0 * fVar119 + fStack_230 * fVar283;
            fVar295 = fStack_1ac * fVar79 + fStack_22c * fVar285;
            fVar239 = in_XMM4._0_4_ * fVar105 + (float)local_228._0_4_ * fVar267;
            fVar240 = in_XMM4._4_4_ * fVar106 + (float)local_228._4_4_ * fVar281;
            fVar241 = in_XMM4._8_4_ * fVar119 + fStack_220 * fVar283;
            fVar242 = in_XMM4._12_4_ * fVar79 + fStack_21c * fVar285;
            fVar197 = auVar110._0_4_ * fVar105 + (float)local_1e8._0_4_ * fVar267;
            fVar120 = auVar110._4_4_ * fVar106 + (float)local_1e8._4_4_ * fVar281;
            fVar124 = auVar110._8_4_ * fVar119 + fStack_1e0 * fVar283;
            fVar121 = auVar110._12_4_ * fVar79 + fStack_1dc * fVar285;
            fVar143 = in_XMM6._0_4_ * fVar105 + (float)local_1d8._0_4_ * fVar267;
            fVar144 = in_XMM6._4_4_ * fVar106 + (float)local_1d8._4_4_ * fVar281;
            fVar145 = in_XMM6._8_4_ * fVar119 + fStack_1d0 * fVar283;
            fVar185 = in_XMM6._12_4_ * fVar79 + fStack_1cc * fVar285;
            fVar189 = fVar105 * (float)local_288._0_4_ + (float)local_1c8._0_4_ * fVar267;
            fVar253 = fVar106 * (float)local_288._4_4_ + (float)local_1c8._4_4_ * fVar281;
            fVar187 = fVar119 * fStack_280 + fStack_1c0 * fVar283;
            fVar195 = fVar79 * fStack_27c + fStack_1bc * fVar285;
            fVar267 = fVar243 * fVar239 - fVar122 * fVar255;
            fVar281 = fVar244 * fVar240 - fVar123 * fVar312;
            auVar132._4_4_ = fVar281;
            auVar132._0_4_ = fVar267;
            fVar283 = fVar252 * fVar241 - fVar125 * fVar286;
            fVar285 = fVar254 * fVar242 - fVar126 * fVar295;
            auVar220._0_4_ = fVar122 * fVar139 - fVar214 * fVar239;
            auVar220._4_4_ = fVar123 * fVar140 - fVar227 * fVar240;
            auVar220._8_4_ = fVar125 * fVar141 - fVar228 * fVar241;
            auVar220._12_4_ = fVar126 * fVar142 - fVar238 * fVar242;
            local_2b8._0_4_ = fVar214 * fVar255 - fVar243 * fVar139;
            local_2b8._4_4_ = fVar227 * fVar312 - fVar244 * fVar140;
            uStack_2b0._0_4_ = fVar228 * fVar286 - fVar252 * fVar141;
            uStack_2b0._4_4_ = fVar238 * fVar295 - fVar254 * fVar142;
            auVar231._0_4_ = fVar186 * fVar255 - fVar198 * fVar239;
            auVar231._4_4_ = fVar188 * fVar312 - fVar199 * fVar240;
            auVar231._8_4_ = fVar194 * fVar286 - fVar212 * fVar241;
            auVar231._12_4_ = fVar196 * fVar295 - fVar213 * fVar242;
            auVar202._0_4_ = fVar239 * fVar296 - fVar186 * fVar139;
            auVar202._4_4_ = fVar240 * fVar298 - fVar188 * fVar140;
            auVar202._8_4_ = fVar241 * fVar302 - fVar194 * fVar141;
            auVar202._12_4_ = fVar242 * fVar311 - fVar196 * fVar142;
            auVar274._0_4_ = fVar139 * fVar198 - fVar255 * fVar296;
            auVar274._4_4_ = fVar140 * fVar199 - fVar312 * fVar298;
            auVar274._8_4_ = fVar141 * fVar212 - fVar286 * fVar302;
            auVar274._12_4_ = fVar142 * fVar213 - fVar295 * fVar311;
            auVar306._0_4_ = fVar198 * fVar122 - fVar186 * fVar243;
            auVar306._4_4_ = fVar199 * fVar123 - fVar188 * fVar244;
            auVar306._8_4_ = fVar212 * fVar125 - fVar194 * fVar252;
            auVar306._12_4_ = fVar213 * fVar126 - fVar196 * fVar254;
            auVar324._0_4_ = fVar186 * fVar214 - fVar122 * fVar296;
            auVar324._4_4_ = fVar188 * fVar227 - fVar123 * fVar298;
            auVar324._8_4_ = fVar194 * fVar228 - fVar125 * fVar302;
            auVar324._12_4_ = fVar196 * fVar238 - fVar126 * fVar311;
            auVar132._8_4_ = fVar283;
            auVar132._12_4_ = fVar285;
            auVar289._0_4_ = fVar243 * fVar296 - fVar214 * fVar198;
            auVar289._4_4_ = fVar244 * fVar298 - fVar227 * fVar199;
            auVar289._8_4_ = fVar252 * fVar302 - fVar228 * fVar212;
            auVar289._12_4_ = fVar254 * fVar311 - fVar238 * fVar213;
            auVar72._0_4_ =
                 fVar296 * fVar267 + fVar198 * auVar220._0_4_ + fVar186 * (float)local_2b8._0_4_;
            auVar72._4_4_ =
                 fVar298 * fVar281 + fVar199 * auVar220._4_4_ + fVar188 * (float)local_2b8._4_4_;
            auVar72._8_4_ =
                 fVar302 * fVar283 + fVar212 * auVar220._8_4_ + fVar194 * (float)uStack_2b0;
            auVar72._12_4_ =
                 fVar311 * fVar285 + fVar213 * auVar220._12_4_ + fVar196 * uStack_2b0._4_4_;
            auVar130 = divps(auVar132,auVar72);
            auVar261 = divps(auVar231,auVar72);
            auVar305 = divps(auVar306,auVar72);
            auVar218 = divps(auVar220,auVar72);
            _local_2a8 = divps(auVar202,auVar72);
            auVar323 = divps(auVar324,auVar72);
            auVar269 = divps(_local_2b8,auVar72);
            _local_298 = divps(auVar274,auVar72);
            auVar108 = divps(auVar289,auVar72);
            fVar267 = fVar197 * auVar130._0_4_ + fVar143 * auVar218._0_4_ + fVar189 * auVar269._0_4_
            ;
            fVar281 = fVar120 * auVar130._4_4_ + fVar144 * auVar218._4_4_ + fVar253 * auVar269._4_4_
            ;
            fVar283 = fVar124 * auVar130._8_4_ + fVar145 * auVar218._8_4_ + fVar187 * auVar269._8_4_
            ;
            fVar285 = fVar121 * auVar130._12_4_ +
                      fVar185 * auVar218._12_4_ + fVar195 * auVar269._12_4_;
            fVar105 = fVar197 * auVar261._0_4_ +
                      fVar143 * local_2a8._0_4_ + fVar189 * local_298._0_4_;
            fVar106 = fVar120 * auVar261._4_4_ +
                      fVar144 * local_2a8._4_4_ + fVar253 * local_298._4_4_;
            fVar119 = fVar124 * auVar261._8_4_ +
                      fVar145 * local_2a8._8_4_ + fVar187 * local_298._8_4_;
            fVar79 = fVar121 * auVar261._12_4_ +
                     fVar185 * local_2a8._12_4_ + fVar195 * local_298._12_4_;
            fVar189 = fVar197 * auVar305._0_4_ + fVar143 * auVar323._0_4_ + fVar189 * auVar108._0_4_
            ;
            fVar253 = fVar120 * auVar305._4_4_ + fVar144 * auVar323._4_4_ + fVar253 * auVar108._4_4_
            ;
            fVar187 = fVar124 * auVar305._8_4_ + fVar145 * auVar323._8_4_ + fVar187 * auVar108._8_4_
            ;
            fVar195 = fVar121 * auVar305._12_4_ +
                      fVar185 * auVar323._12_4_ + fVar195 * auVar108._12_4_;
          }
        }
        pRVar1 = ray + 0x10;
        fVar197 = *(float *)pRVar1;
        fVar120 = *(float *)(ray + 0x14);
        fVar124 = *(float *)(ray + 0x18);
        auVar127 = *(undefined1 (*) [12])pRVar1;
        fVar121 = *(float *)(ray + 0x1c);
        auVar326 = *(undefined1 (*) [16])pRVar1;
        pRVar1 = ray + 0x20;
        fVar122 = *(float *)pRVar1;
        fVar123 = *(float *)(ray + 0x24);
        fVar125 = *(float *)(ray + 0x28);
        auVar256 = *(undefined1 (*) [12])pRVar1;
        fVar126 = *(float *)(ray + 0x2c);
        auVar29 = *(undefined1 (*) [16])pRVar1;
        fVar139 = *(float *)ray;
        fVar140 = *(float *)(ray + 4);
        fVar141 = *(float *)(ray + 8);
        auVar245 = *(undefined1 (*) [12])ray;
        fVar142 = *(float *)(ray + 0xc);
        auVar74 = *(undefined1 (*) [16])ray;
        pRVar1 = ray + 0x40;
        fVar143 = *(float *)pRVar1;
        fVar144 = *(float *)(ray + 0x44);
        fVar145 = *(float *)(ray + 0x48);
        auVar45 = *(undefined1 (*) [12])pRVar1;
        fVar185 = *(float *)(ray + 0x4c);
        auVar292 = *(undefined1 (*) [16])pRVar1;
        pRVar1 = ray + 0x50;
        fVar186 = *(float *)pRVar1;
        fVar188 = *(float *)(ray + 0x54);
        fVar194 = *(float *)(ray + 0x58);
        auVar229 = *(undefined1 (*) [12])pRVar1;
        fVar196 = *(float *)(ray + 0x5c);
        auVar278 = *(undefined1 (*) [16])pRVar1;
        pRVar1 = ray + 0x60;
        fVar198 = *(float *)pRVar1;
        fVar199 = *(float *)(ray + 100);
        fVar212 = *(float *)(ray + 0x68);
        auVar215 = *(undefined1 (*) [12])pRVar1;
        fVar213 = *(float *)(ray + 0x6c);
        auVar225 = *(undefined1 (*) [16])pRVar1;
        *(float *)ray =
             auVar130._0_4_ * fVar139 +
             auVar218._0_4_ * fVar197 + auVar269._0_4_ * fVar122 + -fVar267;
        *(float *)(ray + 4) =
             auVar130._4_4_ * fVar140 +
             auVar218._4_4_ * fVar120 + auVar269._4_4_ * fVar123 + -fVar281;
        *(float *)(ray + 8) =
             auVar130._8_4_ * fVar141 +
             auVar218._8_4_ * fVar124 + auVar269._8_4_ * fVar125 + -fVar283;
        *(float *)(ray + 0xc) =
             auVar130._12_4_ * fVar142 +
             auVar218._12_4_ * fVar121 + auVar269._12_4_ * fVar126 + -fVar285;
        *(float *)(ray + 0x10) =
             auVar261._0_4_ * fVar139 +
             (float)local_2a8._0_4_ * fVar197 + (float)local_298._0_4_ * fVar122 + -fVar105;
        *(float *)(ray + 0x14) =
             auVar261._4_4_ * fVar140 +
             (float)local_2a8._4_4_ * fVar120 + (float)local_298._4_4_ * fVar123 + -fVar106;
        *(float *)(ray + 0x18) =
             auVar261._8_4_ * fVar141 + fStack_2a0 * fVar124 + fStack_290 * fVar125 + -fVar119;
        *(float *)(ray + 0x1c) =
             auVar261._12_4_ * fVar142 + fStack_29c * fVar121 + fStack_28c * fVar126 + -fVar79;
        *(float *)(ray + 0x20) =
             auVar305._0_4_ * fVar139 +
             auVar323._0_4_ * fVar197 + auVar108._0_4_ * fVar122 + -fVar189;
        *(float *)(ray + 0x24) =
             auVar305._4_4_ * fVar140 +
             auVar323._4_4_ * fVar120 + auVar108._4_4_ * fVar123 + -fVar253;
        *(float *)(ray + 0x28) =
             auVar305._8_4_ * fVar141 +
             auVar323._8_4_ * fVar124 + auVar108._8_4_ * fVar125 + -fVar187;
        *(float *)(ray + 0x2c) =
             auVar305._12_4_ * fVar142 +
             auVar323._12_4_ * fVar121 + auVar108._12_4_ * fVar126 + -fVar195;
        *(float *)(ray + 0x40) =
             auVar130._0_4_ * fVar143 + auVar218._0_4_ * fVar186 + auVar269._0_4_ * fVar198;
        *(float *)(ray + 0x44) =
             auVar130._4_4_ * fVar144 + auVar218._4_4_ * fVar188 + auVar269._4_4_ * fVar199;
        *(float *)(ray + 0x48) =
             auVar130._8_4_ * fVar145 + auVar218._8_4_ * fVar194 + auVar269._8_4_ * fVar212;
        *(float *)(ray + 0x4c) =
             auVar130._12_4_ * fVar185 + auVar218._12_4_ * fVar196 + auVar269._12_4_ * fVar213;
        *(float *)(ray + 0x50) =
             auVar261._0_4_ * fVar143 +
             (float)local_2a8._0_4_ * fVar186 + (float)local_298._0_4_ * fVar198;
        *(float *)(ray + 0x54) =
             auVar261._4_4_ * fVar144 +
             (float)local_2a8._4_4_ * fVar188 + (float)local_298._4_4_ * fVar199;
        *(float *)(ray + 0x58) =
             auVar261._8_4_ * fVar145 + fStack_2a0 * fVar194 + fStack_290 * fVar212;
        *(float *)(ray + 0x5c) =
             auVar261._12_4_ * fVar185 + fStack_29c * fVar196 + fStack_28c * fVar213;
        *(float *)(ray + 0x60) =
             auVar305._0_4_ * fVar143 + auVar323._0_4_ * fVar186 + auVar108._0_4_ * fVar198;
        *(float *)(ray + 100) =
             auVar305._4_4_ * fVar144 + auVar323._4_4_ * fVar188 + auVar108._4_4_ * fVar199;
        *(float *)(ray + 0x68) =
             auVar305._8_4_ * fVar145 + auVar323._8_4_ * fVar194 + auVar108._8_4_ * fVar212;
        *(float *)(ray + 0x6c) =
             auVar305._12_4_ * fVar185 + auVar323._12_4_ * fVar196 + auVar108._12_4_ * fVar213;
        local_68 = context->args;
        local_48 = local_58._0_8_;
        uStack_40 = local_58._8_8_;
        local_78 = pAVar9;
        uStack_70 = pRVar4;
        local_58 = auVar146;
        (**(code **)&pAVar9->field_0xa0)(&local_48,&(pAVar9->super_AccelData).field_0x58,ray);
        local_258 = auVar245._0_8_;
        uStack_250 = auVar74._8_8_;
        *(undefined1 (*) [8])ray = local_258;
        *(undefined8 *)(ray + 8) = uStack_250;
        local_248 = auVar127._0_8_;
        uStack_240 = auVar326._8_8_;
        *(undefined1 (*) [8])(ray + 0x10) = local_248;
        *(undefined8 *)(ray + 0x18) = uStack_240;
        local_2b8 = auVar256._0_8_;
        uStack_2b0 = auVar29._8_8_;
        *(undefined1 (*) [8])(ray + 0x20) = local_2b8;
        *(undefined8 *)(ray + 0x28) = uStack_2b0;
        local_208 = auVar45._0_8_;
        uStack_200 = auVar292._8_8_;
        *(undefined1 (*) [8])(ray + 0x40) = local_208;
        *(undefined8 *)(ray + 0x48) = uStack_200;
        local_278 = auVar229._0_8_;
        uStack_270 = auVar278._8_8_;
        *(undefined1 (*) [8])(ray + 0x50) = local_278;
        *(undefined8 *)(ray + 0x58) = uStack_270;
        local_268 = auVar215._0_8_;
        uStack_260 = auVar225._8_8_;
        *(undefined1 (*) [8])(ray + 0x60) = local_268;
        *(undefined8 *)(ray + 0x68) = uStack_260;
        fVar267 = *(float *)(ray + 0x84);
        fVar281 = *(float *)(ray + 0x88);
        fVar283 = *(float *)(ray + 0x8c);
        *(uint *)this = -(uint)(*(float *)(ray + 0x80) < 0.0);
        *(uint *)(this + 4) = -(uint)(fVar267 < 0.0);
        *(uint *)(this + 8) = -(uint)(fVar281 < 0.0);
        *(uint *)(this + 0xc) = -(uint)(fVar283 < 0.0);
        pRVar4->instID[0] = 0xffffffff;
        pRVar4->instPrimID[0] = 0xffffffff;
        uVar11 = extraout_RDX_00;
      }
      goto LAB_0075be6d;
    }
  }
  *(undefined8 *)this = mm_lookupmask_ps._0_8_;
  *(undefined8 *)(this + 8) = uVar2;
LAB_0075be6d:
  vVar333.field_0._8_8_ = uVar11;
  vVar333.field_0._0_8_ = this;
  return (vbool<4>)vVar333.field_0;
}

Assistant:

vbool<K> InstanceArrayIntersectorKMB<K>::occluded(const vbool<K>& valid_i, const Precalculations& pre, RayK<K>& ray, RayQueryContext* context, const Primitive& prim)
    {
      vbool<K> valid = valid_i;
      const InstanceArray* instance = context->scene->get<InstanceArray>(prim.instID_);
      Accel* object = instance->getObject(prim.primID_);
      if (!object) return false;

      /* perform ray mask test */
#if defined(EMBREE_RAY_MASK)
      valid &= (ray.mask & instance->mask) != 0;
      if (none(valid)) return false;
#endif
        
      RTCRayQueryContext* user_context = context->user;
      vbool<K> occluded = false;
      if (likely(instance_id_stack::push(user_context, prim.instID_, prim.primID_)))
      {
        AffineSpace3vf<K> world2local = instance->getWorld2Local<K>(prim.primID_, valid, ray.time());
        const Vec3vf<K> ray_org = ray.org;
        const Vec3vf<K> ray_dir = ray.dir;
        ray.org = xfmPoint(world2local, ray_org);
        ray.dir = xfmVector(world2local, ray_dir);
        RayQueryContext newcontext((Scene*)object, user_context, context->args);
        object->intersectors.occluded(valid, ray, &newcontext);
        ray.org = ray_org;
        ray.dir = ray_dir;
        occluded = ray.tfar < 0.0f;
        instance_id_stack::pop(user_context);
      }
      return occluded;
    }